

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

void ImGui::ShowDemoWindow(bool *p_open)

{
  undefined8 uVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  bool bVar26;
  bool bVar27;
  bool bVar28;
  ImU32 IVar29;
  ImU32 IVar30;
  ImGuiMouseCursor IVar31;
  ImGuiContext *pIVar32;
  ImGuiIO *pIVar33;
  ImDrawList *pIVar34;
  ImGuiStyle *pIVar35;
  void *pvVar36;
  char cVar37;
  uint uVar38;
  long lVar39;
  ulong uVar40;
  int n;
  int obj_i;
  int iVar41;
  bool *pbVar42;
  int i;
  ImGuiWindowFlags flags;
  long lVar43;
  char *pcVar44;
  char *pcVar45;
  int i_13;
  int i_2;
  long lVar46;
  undefined8 *puVar47;
  MyDocument *doc;
  int i_11;
  uint uVar48;
  long lVar49;
  undefined **ppuVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  double dVar54;
  undefined4 extraout_XMM0_Db;
  ImVec2 IVar55;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar66;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined4 extraout_XMM0_Dd;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  ulong uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  int iVar88;
  undefined1 auVar86 [16];
  int iVar89;
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  int iVar103;
  int iVar107;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  ImVec2 canvas_sz;
  ImVec2 gradient_size;
  char label [128];
  float local_158;
  float fStack_154;
  undefined4 uStack_14c;
  ImVec2 local_148;
  ImVec2 local_140;
  ImVec2 local_138 [2];
  undefined1 local_128 [8];
  undefined8 uStack_120;
  ImVec2 local_110;
  undefined1 local_108 [8];
  undefined8 uStack_100;
  ImVec2 local_f0;
  ImVec2 local_e8;
  int local_dc;
  undefined1 local_d8 [8];
  ImVec2 IStack_d0;
  ImVec2 local_c8;
  ImVec2 IStack_c0;
  char *local_b8;
  char *pcStack_b0;
  char *local_a8;
  bool *local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  long lVar69;
  
  pIVar32 = GetCurrentContext();
  if (pIVar32 == (ImGuiContext *)0x0) {
    __assert_fail("ImGui::GetCurrentContext() != __null && \"Missing dear imgui context. Refer to examples app!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui_demo.cpp"
                  ,0xf9,"void ImGui::ShowDemoWindow(bool *)");
  }
  if ((ShowDemoWindow::show_app_main_menu_bar == true) && (bVar26 = BeginMainMenuBar(), bVar26)) {
    bVar26 = BeginMenu("File",true);
    if (bVar26) {
      ShowExampleMenuFile();
      EndMenu();
    }
    bVar26 = BeginMenu("Edit",true);
    if (bVar26) {
      MenuItem("Undo","CTRL+Z",false,true);
      MenuItem("Redo","CTRL+Y",false,false);
      Separator();
      MenuItem("Cut","CTRL+X",false,true);
      MenuItem("Copy","CTRL+C",false,true);
      MenuItem("Paste","CTRL+V",false,true);
      EndMenu();
    }
    EndMainMenuBar();
  }
  if (ShowDemoWindow::show_app_documents == true) {
    if ((ShowExampleAppDocuments(bool*)::app == '\0') &&
       (iVar41 = __cxa_guard_acquire(&ShowExampleAppDocuments(bool*)::app), iVar41 != 0)) {
      ExampleAppDocuments::ExampleAppDocuments
                ((ExampleAppDocuments *)&ShowExampleAppDocuments(bool*)::app);
      __cxa_atexit(ExampleAppDocuments::~ExampleAppDocuments,&ShowExampleAppDocuments(bool*)::app,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppDocuments(bool*)::app);
    }
    bVar26 = Begin("Example: Documents",&ShowDemoWindow::show_app_documents,0x400);
    if (bVar26) {
      bVar26 = BeginMenuBar();
      if (bVar26) {
        bVar26 = BeginMenu("File",true);
        if (bVar26) {
          if ((long)ShowExampleAppDocuments(bool*)::app < 1) {
            iVar41 = 0;
          }
          else {
            lVar43 = 0;
            iVar41 = 0;
            do {
              iVar41 = iVar41 + (uint)*(byte *)(DAT_00233e60 + 8 + lVar43);
              lVar43 = lVar43 + 0x20;
            } while ((long)ShowExampleAppDocuments(bool*)::app << 5 != lVar43);
          }
          bVar26 = BeginMenu("Open",iVar41 < ShowExampleAppDocuments(bool*)::app);
          if (bVar26) {
            if (0 < ShowExampleAppDocuments(bool*)::app) {
              lVar46 = 8;
              lVar49 = 0;
              lVar43 = DAT_00233e60;
              do {
                lVar39 = lVar43;
                if ((*(char *)(lVar43 + lVar46) == '\0') &&
                   (bVar26 = MenuItem(*(char **)(lVar43 + -8 + lVar46),(char *)0x0,false,true),
                   lVar39 = DAT_00233e60, bVar26)) {
                  *(undefined1 *)(lVar43 + lVar46) = 1;
                }
                lVar49 = lVar49 + 1;
                lVar46 = lVar46 + 0x20;
                lVar43 = lVar39;
              } while (lVar49 < ShowExampleAppDocuments(bool*)::app);
            }
            EndMenu();
          }
          bVar26 = MenuItem("Close All Documents",(char *)0x0,false,iVar41 != 0);
          lVar43 = DAT_00233e60;
          auVar25 = _DAT_001bf160;
          if ((bVar26) && (0 < (long)ShowExampleAppDocuments(bool*)::app)) {
            uVar38 = ShowExampleAppDocuments(bool*)::app + 0xf;
            lVar46 = (long)ShowExampleAppDocuments(bool*)::app + -1;
            auVar56._8_4_ = (int)lVar46;
            auVar56._0_8_ = lVar46;
            auVar56._12_4_ = (int)((ulong)lVar46 >> 0x20);
            lVar46 = 0;
            auVar57 = auVar56;
            auVar68 = _DAT_001c4b30;
            auVar70 = _DAT_001c4b40;
            auVar71 = _DAT_001c4b50;
            auVar72 = _DAT_001c4b60;
            auVar73 = _DAT_001c4b70;
            auVar74 = _DAT_001c4b80;
            auVar75 = _DAT_001bf140;
            auVar76 = _DAT_001bf150;
            do {
              auVar86 = auVar56 ^ auVar25;
              auVar90 = auVar76 ^ auVar25;
              iVar41 = auVar86._0_4_;
              iVar103 = -(uint)(iVar41 < auVar90._0_4_);
              iVar66 = auVar86._4_4_;
              auVar92._4_4_ = -(uint)(iVar66 < auVar90._4_4_);
              iVar88 = auVar86._8_4_;
              iVar107 = -(uint)(iVar88 < auVar90._8_4_);
              iVar89 = auVar86._12_4_;
              auVar92._12_4_ = -(uint)(iVar89 < auVar90._12_4_);
              auVar86._4_4_ = iVar103;
              auVar86._0_4_ = iVar103;
              auVar86._8_4_ = iVar107;
              auVar86._12_4_ = iVar107;
              auVar86 = pshuflw(auVar57,auVar86,0xe8);
              auVar91._4_4_ = -(uint)(auVar90._4_4_ == iVar66);
              auVar91._12_4_ = -(uint)(auVar90._12_4_ == iVar89);
              auVar91._0_4_ = auVar91._4_4_;
              auVar91._8_4_ = auVar91._12_4_;
              auVar77 = pshuflw(in_XMM11,auVar91,0xe8);
              auVar92._0_4_ = auVar92._4_4_;
              auVar92._8_4_ = auVar92._12_4_;
              auVar90 = pshuflw(auVar86,auVar92,0xe8);
              auVar57._8_4_ = 0xffffffff;
              auVar57._0_8_ = 0xffffffffffffffff;
              auVar57._12_4_ = 0xffffffff;
              auVar57 = (auVar90 | auVar77 & auVar86) ^ auVar57;
              auVar57 = packssdw(auVar57,auVar57);
              if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar43 + 0xb + lVar46) = 1;
              }
              auVar77._4_4_ = iVar103;
              auVar77._0_4_ = iVar103;
              auVar77._8_4_ = iVar107;
              auVar77._12_4_ = iVar107;
              auVar92 = auVar91 & auVar77 | auVar92;
              auVar57 = packssdw(auVar92,auVar92);
              auVar90._8_4_ = 0xffffffff;
              auVar90._0_8_ = 0xffffffffffffffff;
              auVar90._12_4_ = 0xffffffff;
              auVar57 = packssdw(auVar57 ^ auVar90,auVar57 ^ auVar90);
              auVar57 = packsswb(auVar57,auVar57);
              if ((auVar57._0_4_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar43 + 0x2b + lVar46) = 1;
              }
              auVar57 = auVar75 ^ auVar25;
              auVar78._0_4_ = -(uint)(iVar41 < auVar57._0_4_);
              auVar78._4_4_ = -(uint)(iVar66 < auVar57._4_4_);
              auVar78._8_4_ = -(uint)(iVar88 < auVar57._8_4_);
              auVar78._12_4_ = -(uint)(iVar89 < auVar57._12_4_);
              auVar93._4_4_ = auVar78._0_4_;
              auVar93._0_4_ = auVar78._0_4_;
              auVar93._8_4_ = auVar78._8_4_;
              auVar93._12_4_ = auVar78._8_4_;
              iVar103 = -(uint)(auVar57._4_4_ == iVar66);
              iVar107 = -(uint)(auVar57._12_4_ == iVar89);
              auVar12._4_4_ = iVar103;
              auVar12._0_4_ = iVar103;
              auVar12._8_4_ = iVar107;
              auVar12._12_4_ = iVar107;
              auVar104._4_4_ = auVar78._4_4_;
              auVar104._0_4_ = auVar78._4_4_;
              auVar104._8_4_ = auVar78._12_4_;
              auVar104._12_4_ = auVar78._12_4_;
              auVar57 = auVar12 & auVar93 | auVar104;
              auVar57 = packssdw(auVar57,auVar57);
              auVar3._8_4_ = 0xffffffff;
              auVar3._0_8_ = 0xffffffffffffffff;
              auVar3._12_4_ = 0xffffffff;
              auVar57 = packssdw(auVar57 ^ auVar3,auVar57 ^ auVar3);
              auVar57 = packsswb(auVar57,auVar57);
              if ((auVar57._0_4_ >> 0x10 & 1) != 0) {
                *(undefined1 *)(lVar43 + 0x4b + lVar46) = 1;
              }
              auVar57 = pshufhw(auVar57,auVar93,0x84);
              auVar13._4_4_ = iVar103;
              auVar13._0_4_ = iVar103;
              auVar13._8_4_ = iVar107;
              auVar13._12_4_ = iVar107;
              auVar90 = pshufhw(auVar78,auVar13,0x84);
              auVar86 = pshufhw(auVar57,auVar104,0x84);
              auVar58._8_4_ = 0xffffffff;
              auVar58._0_8_ = 0xffffffffffffffff;
              auVar58._12_4_ = 0xffffffff;
              auVar58 = (auVar86 | auVar90 & auVar57) ^ auVar58;
              auVar57 = packssdw(auVar58,auVar58);
              auVar57 = packsswb(auVar57,auVar57);
              if ((auVar57._0_4_ >> 0x18 & 1) != 0) {
                *(undefined1 *)(lVar43 + 0x6b + lVar46) = 1;
              }
              auVar57 = auVar74 ^ auVar25;
              auVar79._0_4_ = -(uint)(iVar41 < auVar57._0_4_);
              auVar79._4_4_ = -(uint)(iVar66 < auVar57._4_4_);
              auVar79._8_4_ = -(uint)(iVar88 < auVar57._8_4_);
              auVar79._12_4_ = -(uint)(iVar89 < auVar57._12_4_);
              auVar14._4_4_ = auVar79._0_4_;
              auVar14._0_4_ = auVar79._0_4_;
              auVar14._8_4_ = auVar79._8_4_;
              auVar14._12_4_ = auVar79._8_4_;
              auVar90 = pshuflw(auVar104,auVar14,0xe8);
              auVar59._0_4_ = -(uint)(auVar57._0_4_ == iVar41);
              auVar59._4_4_ = -(uint)(auVar57._4_4_ == iVar66);
              auVar59._8_4_ = -(uint)(auVar57._8_4_ == iVar88);
              auVar59._12_4_ = -(uint)(auVar57._12_4_ == iVar89);
              auVar94._4_4_ = auVar59._4_4_;
              auVar94._0_4_ = auVar59._4_4_;
              auVar94._8_4_ = auVar59._12_4_;
              auVar94._12_4_ = auVar59._12_4_;
              auVar57 = pshuflw(auVar59,auVar94,0xe8);
              auVar95._4_4_ = auVar79._4_4_;
              auVar95._0_4_ = auVar79._4_4_;
              auVar95._8_4_ = auVar79._12_4_;
              auVar95._12_4_ = auVar79._12_4_;
              auVar86 = pshuflw(auVar79,auVar95,0xe8);
              auVar4._8_4_ = 0xffffffff;
              auVar4._0_8_ = 0xffffffffffffffff;
              auVar4._12_4_ = 0xffffffff;
              auVar57 = packssdw(auVar57 & auVar90,(auVar86 | auVar57 & auVar90) ^ auVar4);
              auVar57 = packsswb(auVar57,auVar57);
              if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar43 + 0x8b + lVar46) = 1;
              }
              auVar15._4_4_ = auVar79._0_4_;
              auVar15._0_4_ = auVar79._0_4_;
              auVar15._8_4_ = auVar79._8_4_;
              auVar15._12_4_ = auVar79._8_4_;
              auVar95 = auVar94 & auVar15 | auVar95;
              auVar86 = packssdw(auVar95,auVar95);
              auVar5._8_4_ = 0xffffffff;
              auVar5._0_8_ = 0xffffffffffffffff;
              auVar5._12_4_ = 0xffffffff;
              auVar57 = packssdw(auVar57,auVar86 ^ auVar5);
              auVar57 = packsswb(auVar57,auVar57);
              if ((auVar57._4_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar43 + 0xab + lVar46) = 1;
              }
              auVar57 = auVar73 ^ auVar25;
              auVar80._0_4_ = -(uint)(iVar41 < auVar57._0_4_);
              auVar80._4_4_ = -(uint)(iVar66 < auVar57._4_4_);
              auVar80._8_4_ = -(uint)(iVar88 < auVar57._8_4_);
              auVar80._12_4_ = -(uint)(iVar89 < auVar57._12_4_);
              auVar96._4_4_ = auVar80._0_4_;
              auVar96._0_4_ = auVar80._0_4_;
              auVar96._8_4_ = auVar80._8_4_;
              auVar96._12_4_ = auVar80._8_4_;
              iVar103 = -(uint)(auVar57._4_4_ == iVar66);
              iVar107 = -(uint)(auVar57._12_4_ == iVar89);
              auVar16._4_4_ = iVar103;
              auVar16._0_4_ = iVar103;
              auVar16._8_4_ = iVar107;
              auVar16._12_4_ = iVar107;
              auVar105._4_4_ = auVar80._4_4_;
              auVar105._0_4_ = auVar80._4_4_;
              auVar105._8_4_ = auVar80._12_4_;
              auVar105._12_4_ = auVar80._12_4_;
              auVar57 = auVar16 & auVar96 | auVar105;
              auVar57 = packssdw(auVar57,auVar57);
              auVar6._8_4_ = 0xffffffff;
              auVar6._0_8_ = 0xffffffffffffffff;
              auVar6._12_4_ = 0xffffffff;
              auVar57 = packssdw(auVar57 ^ auVar6,auVar57 ^ auVar6);
              auVar57 = packsswb(auVar57,auVar57);
              if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar43 + 0xcb + lVar46) = 1;
              }
              auVar57 = pshufhw(auVar57,auVar96,0x84);
              auVar17._4_4_ = iVar103;
              auVar17._0_4_ = iVar103;
              auVar17._8_4_ = iVar107;
              auVar17._12_4_ = iVar107;
              auVar90 = pshufhw(auVar80,auVar17,0x84);
              auVar86 = pshufhw(auVar57,auVar105,0x84);
              auVar60._8_4_ = 0xffffffff;
              auVar60._0_8_ = 0xffffffffffffffff;
              auVar60._12_4_ = 0xffffffff;
              auVar60 = (auVar86 | auVar90 & auVar57) ^ auVar60;
              auVar57 = packssdw(auVar60,auVar60);
              auVar57 = packsswb(auVar57,auVar57);
              if ((auVar57._6_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar43 + 0xeb + lVar46) = 1;
              }
              auVar57 = auVar72 ^ auVar25;
              auVar81._0_4_ = -(uint)(iVar41 < auVar57._0_4_);
              auVar81._4_4_ = -(uint)(iVar66 < auVar57._4_4_);
              auVar81._8_4_ = -(uint)(iVar88 < auVar57._8_4_);
              auVar81._12_4_ = -(uint)(iVar89 < auVar57._12_4_);
              auVar18._4_4_ = auVar81._0_4_;
              auVar18._0_4_ = auVar81._0_4_;
              auVar18._8_4_ = auVar81._8_4_;
              auVar18._12_4_ = auVar81._8_4_;
              auVar90 = pshuflw(auVar105,auVar18,0xe8);
              auVar61._0_4_ = -(uint)(auVar57._0_4_ == iVar41);
              auVar61._4_4_ = -(uint)(auVar57._4_4_ == iVar66);
              auVar61._8_4_ = -(uint)(auVar57._8_4_ == iVar88);
              auVar61._12_4_ = -(uint)(auVar57._12_4_ == iVar89);
              auVar97._4_4_ = auVar61._4_4_;
              auVar97._0_4_ = auVar61._4_4_;
              auVar97._8_4_ = auVar61._12_4_;
              auVar97._12_4_ = auVar61._12_4_;
              auVar57 = pshuflw(auVar61,auVar97,0xe8);
              auVar98._4_4_ = auVar81._4_4_;
              auVar98._0_4_ = auVar81._4_4_;
              auVar98._8_4_ = auVar81._12_4_;
              auVar98._12_4_ = auVar81._12_4_;
              auVar86 = pshuflw(auVar81,auVar98,0xe8);
              auVar82._8_4_ = 0xffffffff;
              auVar82._0_8_ = 0xffffffffffffffff;
              auVar82._12_4_ = 0xffffffff;
              auVar82 = (auVar86 | auVar57 & auVar90) ^ auVar82;
              auVar86 = packssdw(auVar82,auVar82);
              auVar57 = packsswb(auVar57 & auVar90,auVar86);
              if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar43 + 0x10b + lVar46) = 1;
              }
              auVar19._4_4_ = auVar81._0_4_;
              auVar19._0_4_ = auVar81._0_4_;
              auVar19._8_4_ = auVar81._8_4_;
              auVar19._12_4_ = auVar81._8_4_;
              auVar98 = auVar97 & auVar19 | auVar98;
              auVar86 = packssdw(auVar98,auVar98);
              auVar7._8_4_ = 0xffffffff;
              auVar7._0_8_ = 0xffffffffffffffff;
              auVar7._12_4_ = 0xffffffff;
              auVar86 = packssdw(auVar86 ^ auVar7,auVar86 ^ auVar7);
              auVar57 = packsswb(auVar57,auVar86);
              if ((auVar57._8_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar43 + 299 + lVar46) = 1;
              }
              auVar57 = auVar71 ^ auVar25;
              auVar83._0_4_ = -(uint)(iVar41 < auVar57._0_4_);
              auVar83._4_4_ = -(uint)(iVar66 < auVar57._4_4_);
              auVar83._8_4_ = -(uint)(iVar88 < auVar57._8_4_);
              auVar83._12_4_ = -(uint)(iVar89 < auVar57._12_4_);
              auVar99._4_4_ = auVar83._0_4_;
              auVar99._0_4_ = auVar83._0_4_;
              auVar99._8_4_ = auVar83._8_4_;
              auVar99._12_4_ = auVar83._8_4_;
              iVar103 = -(uint)(auVar57._4_4_ == iVar66);
              iVar107 = -(uint)(auVar57._12_4_ == iVar89);
              auVar20._4_4_ = iVar103;
              auVar20._0_4_ = iVar103;
              auVar20._8_4_ = iVar107;
              auVar20._12_4_ = iVar107;
              auVar106._4_4_ = auVar83._4_4_;
              auVar106._0_4_ = auVar83._4_4_;
              auVar106._8_4_ = auVar83._12_4_;
              auVar106._12_4_ = auVar83._12_4_;
              auVar57 = auVar20 & auVar99 | auVar106;
              auVar57 = packssdw(auVar57,auVar57);
              auVar8._8_4_ = 0xffffffff;
              auVar8._0_8_ = 0xffffffffffffffff;
              auVar8._12_4_ = 0xffffffff;
              auVar57 = packssdw(auVar57 ^ auVar8,auVar57 ^ auVar8);
              auVar57 = packsswb(auVar57,auVar57);
              if ((auVar57 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar43 + 0x14b + lVar46) = 1;
              }
              auVar57 = pshufhw(auVar57,auVar99,0x84);
              auVar21._4_4_ = iVar103;
              auVar21._0_4_ = iVar103;
              auVar21._8_4_ = iVar107;
              auVar21._12_4_ = iVar107;
              auVar90 = pshufhw(auVar83,auVar21,0x84);
              auVar86 = pshufhw(auVar57,auVar106,0x84);
              auVar62._8_4_ = 0xffffffff;
              auVar62._0_8_ = 0xffffffffffffffff;
              auVar62._12_4_ = 0xffffffff;
              auVar62 = (auVar86 | auVar90 & auVar57) ^ auVar62;
              auVar57 = packssdw(auVar62,auVar62);
              auVar57 = packsswb(auVar57,auVar57);
              if ((auVar57._10_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar43 + 0x16b + lVar46) = 1;
              }
              auVar57 = auVar70 ^ auVar25;
              auVar84._0_4_ = -(uint)(iVar41 < auVar57._0_4_);
              auVar84._4_4_ = -(uint)(iVar66 < auVar57._4_4_);
              auVar84._8_4_ = -(uint)(iVar88 < auVar57._8_4_);
              auVar84._12_4_ = -(uint)(iVar89 < auVar57._12_4_);
              auVar22._4_4_ = auVar84._0_4_;
              auVar22._0_4_ = auVar84._0_4_;
              auVar22._8_4_ = auVar84._8_4_;
              auVar22._12_4_ = auVar84._8_4_;
              auVar90 = pshuflw(auVar106,auVar22,0xe8);
              auVar63._0_4_ = -(uint)(auVar57._0_4_ == iVar41);
              auVar63._4_4_ = -(uint)(auVar57._4_4_ == iVar66);
              auVar63._8_4_ = -(uint)(auVar57._8_4_ == iVar88);
              auVar63._12_4_ = -(uint)(auVar57._12_4_ == iVar89);
              auVar100._4_4_ = auVar63._4_4_;
              auVar100._0_4_ = auVar63._4_4_;
              auVar100._8_4_ = auVar63._12_4_;
              auVar100._12_4_ = auVar63._12_4_;
              auVar57 = pshuflw(auVar63,auVar100,0xe8);
              auVar101._4_4_ = auVar84._4_4_;
              auVar101._0_4_ = auVar84._4_4_;
              auVar101._8_4_ = auVar84._12_4_;
              auVar101._12_4_ = auVar84._12_4_;
              auVar86 = pshuflw(auVar84,auVar101,0xe8);
              auVar9._8_4_ = 0xffffffff;
              auVar9._0_8_ = 0xffffffffffffffff;
              auVar9._12_4_ = 0xffffffff;
              auVar57 = packssdw(auVar57 & auVar90,(auVar86 | auVar57 & auVar90) ^ auVar9);
              auVar57 = packsswb(auVar57,auVar57);
              if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar43 + 0x18b + lVar46) = 1;
              }
              auVar23._4_4_ = auVar84._0_4_;
              auVar23._0_4_ = auVar84._0_4_;
              auVar23._8_4_ = auVar84._8_4_;
              auVar23._12_4_ = auVar84._8_4_;
              auVar101 = auVar100 & auVar23 | auVar101;
              auVar86 = packssdw(auVar101,auVar101);
              auVar10._8_4_ = 0xffffffff;
              auVar10._0_8_ = 0xffffffffffffffff;
              auVar10._12_4_ = 0xffffffff;
              auVar57 = packssdw(auVar57,auVar86 ^ auVar10);
              auVar57 = packsswb(auVar57,auVar57);
              if ((auVar57._12_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar43 + 0x1ab + lVar46) = 1;
              }
              auVar57 = auVar68 ^ auVar25;
              auVar85._0_4_ = -(uint)(iVar41 < auVar57._0_4_);
              auVar85._4_4_ = -(uint)(iVar66 < auVar57._4_4_);
              auVar85._8_4_ = -(uint)(iVar88 < auVar57._8_4_);
              auVar85._12_4_ = -(uint)(iVar89 < auVar57._12_4_);
              auVar102._4_4_ = auVar85._0_4_;
              auVar102._0_4_ = auVar85._0_4_;
              auVar102._8_4_ = auVar85._8_4_;
              auVar102._12_4_ = auVar85._8_4_;
              iVar41 = -(uint)(auVar57._4_4_ == iVar66);
              iVar66 = -(uint)(auVar57._12_4_ == iVar89);
              auVar87._4_4_ = iVar41;
              auVar87._0_4_ = iVar41;
              auVar87._8_4_ = iVar66;
              auVar87._12_4_ = iVar66;
              auVar64._4_4_ = auVar85._4_4_;
              auVar64._0_4_ = auVar85._4_4_;
              auVar64._8_4_ = auVar85._12_4_;
              auVar64._12_4_ = auVar85._12_4_;
              auVar64 = auVar87 & auVar102 | auVar64;
              auVar57 = packssdw(auVar64,auVar64);
              auVar11._8_4_ = 0xffffffff;
              auVar11._0_8_ = 0xffffffffffffffff;
              auVar11._12_4_ = 0xffffffff;
              auVar57 = packssdw(auVar57 ^ auVar11,auVar57 ^ auVar11);
              auVar57 = packsswb(auVar57,auVar57);
              if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar43 + 0x1cb + lVar46) = 1;
              }
              auVar57 = pshufhw(auVar57,auVar102,0x84);
              in_XMM11 = pshufhw(auVar85,auVar87,0x84);
              in_XMM11 = in_XMM11 & auVar57;
              auVar24._4_4_ = auVar85._4_4_;
              auVar24._0_4_ = auVar85._4_4_;
              auVar24._8_4_ = auVar85._12_4_;
              auVar24._12_4_ = auVar85._12_4_;
              auVar57 = pshufhw(auVar57,auVar24,0x84);
              auVar65._8_4_ = 0xffffffff;
              auVar65._0_8_ = 0xffffffffffffffff;
              auVar65._12_4_ = 0xffffffff;
              auVar65 = (auVar57 | in_XMM11) ^ auVar65;
              auVar57 = packssdw(auVar65,auVar65);
              auVar57 = packsswb(auVar57,auVar57);
              if ((auVar57._14_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar43 + 0x1eb + lVar46) = 1;
              }
              lVar49 = (long)DAT_001c4b90;
              lVar69 = auVar76._8_8_;
              auVar76._0_8_ = auVar76._0_8_ + lVar49;
              lVar39 = DAT_001c4b90._8_8_;
              auVar76._8_8_ = lVar69 + lVar39;
              lVar69 = auVar75._8_8_;
              auVar75._0_8_ = auVar75._0_8_ + lVar49;
              auVar75._8_8_ = lVar69 + lVar39;
              lVar69 = auVar74._8_8_;
              auVar74._0_8_ = auVar74._0_8_ + lVar49;
              auVar74._8_8_ = lVar69 + lVar39;
              lVar69 = auVar73._8_8_;
              auVar73._0_8_ = auVar73._0_8_ + lVar49;
              auVar73._8_8_ = lVar69 + lVar39;
              lVar69 = auVar72._8_8_;
              auVar72._0_8_ = auVar72._0_8_ + lVar49;
              auVar72._8_8_ = lVar69 + lVar39;
              lVar69 = auVar71._8_8_;
              auVar71._0_8_ = auVar71._0_8_ + lVar49;
              auVar71._8_8_ = lVar69 + lVar39;
              lVar69 = auVar70._8_8_;
              auVar70._0_8_ = auVar70._0_8_ + lVar49;
              auVar70._8_8_ = lVar69 + lVar39;
              lVar69 = auVar68._8_8_;
              auVar68._0_8_ = auVar68._0_8_ + lVar49;
              auVar68._8_8_ = lVar69 + lVar39;
              lVar46 = lVar46 + 0x200;
              auVar57 = _DAT_001c4b90;
            } while ((ulong)(uVar38 >> 4) << 9 != lVar46);
          }
          MenuItem("Exit","Alt+F4",false,true);
          EndMenu();
        }
        EndMenuBar();
      }
      local_58 = p_open;
      if (0 < ShowExampleAppDocuments(bool*)::app) {
        lVar46 = 8;
        lVar43 = 0;
        do {
          lVar49 = DAT_00233e60;
          if (lVar43 != 0) {
            SameLine(0.0,-1.0);
          }
          puVar47 = (undefined8 *)(lVar46 + lVar49 + -8);
          PushID(puVar47);
          bVar26 = Checkbox((char *)*puVar47,(bool *)(lVar46 + lVar49));
          if ((bVar26) && (*(bool *)(lVar46 + lVar49) == false)) {
            *(undefined1 *)(lVar49 + lVar46) = 0;
            *(undefined1 *)(lVar49 + 2 + lVar46) = 0;
          }
          PopID();
          lVar43 = lVar43 + 1;
          lVar46 = lVar46 + 0x20;
        } while (lVar43 < ShowExampleAppDocuments(bool*)::app);
      }
      Separator();
      bVar26 = BeginTabBar("##tabs",0x41);
      p_open = local_58;
      if (bVar26) {
        if (0 < ShowExampleAppDocuments(bool*)::app) {
          lVar46 = 9;
          lVar49 = 0;
          lVar43 = DAT_00233e60;
          iVar41 = ShowExampleAppDocuments(bool*)::app;
          do {
            cVar37 = *(char *)(lVar43 + -1 + lVar46);
            lVar39 = lVar43;
            if ((cVar37 == '\0') && (*(char *)(lVar43 + lVar46) == '\x01')) {
              SetTabItemClosed(*(char **)(lVar43 + -9 + lVar46));
              cVar37 = *(char *)(lVar43 + -1 + lVar46);
              lVar39 = DAT_00233e60;
              iVar41 = ShowExampleAppDocuments(bool*)::app;
            }
            *(char *)(lVar43 + lVar46) = cVar37;
            lVar49 = lVar49 + 1;
            lVar46 = lVar46 + 0x20;
            lVar43 = lVar39;
          } while (lVar49 < iVar41);
          if (0 < iVar41) {
            lVar46 = 8;
            lVar43 = 0;
            do {
              lVar49 = DAT_00233e60;
              if (*(char *)(DAT_00233e60 + lVar46) == '\x01') {
                bVar26 = BeginTabItem(*(char **)(DAT_00233e60 + -8 + lVar46),
                                      (bool *)(DAT_00233e60 + lVar46),
                                      (uint)*(byte *)(DAT_00233e60 + 2 + lVar46));
                if ((*(char *)(lVar49 + lVar46) == '\0') &&
                   (*(char *)(lVar49 + 2 + lVar46) == '\x01')) {
                  *(undefined1 *)(lVar49 + lVar46) = 1;
                  *(undefined1 *)(lVar49 + 3 + lVar46) = 1;
                }
                doc = (MyDocument *)(lVar49 + lVar46 + -8);
                MyDocument::DisplayContextMenu(doc);
                if (bVar26) {
                  MyDocument::DisplayContents(doc);
                  EndTabItem();
                }
              }
              lVar43 = lVar43 + 1;
              lVar46 = lVar46 + 0x20;
            } while (lVar43 < ShowExampleAppDocuments(bool*)::app);
          }
        }
        EndTabBar();
      }
      if (ShowExampleAppDocuments(bool*)::close_queue == '\0') {
        ShowDemoWindow();
      }
      uVar67 = _close_queue & 0xffffffff;
      if (ShowExampleAppDocuments(bool*)::close_queue == 0) {
        if (0 < ShowExampleAppDocuments(bool*)::app) {
          lVar49 = 0;
          uVar67 = 0;
          lVar46 = 0;
          lVar43 = DAT_00233e60;
          iVar41 = ShowExampleAppDocuments(bool*)::app;
          do {
            iVar66 = (int)uVar67;
            if (*(char *)(lVar43 + 0xb + lVar49) == '\x01') {
              *(undefined1 *)(lVar43 + 0xb + lVar49) = 0;
              if (iVar66 == DAT_00233e74) {
                if (iVar66 == 0) {
                  iVar41 = 8;
                }
                else {
                  iVar41 = ((int)(uVar67 >> 0x1f) + iVar66 >> 1) + iVar66;
                }
                iVar88 = iVar66 + 1;
                if (iVar66 + 1 < iVar41) {
                  iVar88 = iVar41;
                }
                pvVar36 = MemAlloc((long)iVar88 << 3);
                if (DAT_00233e78 != (void *)0x0) {
                  memcpy(pvVar36,DAT_00233e78,(long)ShowExampleAppDocuments(bool*)::close_queue << 3
                        );
                  MemFree(DAT_00233e78);
                }
                _close_queue = CONCAT44(iVar88,ShowExampleAppDocuments(bool*)::close_queue);
                iVar66 = ShowExampleAppDocuments(bool*)::close_queue;
                DAT_00233e78 = pvVar36;
              }
              *(long *)((long)DAT_00233e78 + (long)iVar66 * 8) = lVar43 + lVar49;
              uVar67 = (ulong)(ShowExampleAppDocuments(bool*)::close_queue + 1U);
              _close_queue = CONCAT44(DAT_00233e74,ShowExampleAppDocuments(bool*)::close_queue + 1U)
              ;
              lVar43 = DAT_00233e60;
              iVar41 = ShowExampleAppDocuments(bool*)::app;
            }
            lVar46 = lVar46 + 1;
            lVar49 = lVar49 + 0x20;
          } while (lVar46 < iVar41);
          if ((int)uVar67 != 0) goto LAB_0013288a;
        }
      }
      else {
LAB_0013288a:
        pvVar36 = DAT_00233e78;
        if ((int)uVar67 < 1) {
          if (DAT_00233e78 != (void *)0x0) goto LAB_00132ae4;
        }
        else {
          uVar40 = 0;
          iVar41 = 0;
          do {
            iVar41 = iVar41 + (uint)*(byte *)(*(long *)((long)DAT_00233e78 + uVar40 * 8) + 10);
            uVar40 = uVar40 + 1;
          } while (uVar67 != uVar40);
          if (iVar41 == 0) {
            uVar40 = 0;
            do {
              lVar43 = *(long *)((long)pvVar36 + uVar40 * 8);
              *(undefined1 *)(lVar43 + 8) = 0;
              *(undefined1 *)(lVar43 + 10) = 0;
              uVar40 = uVar40 + 1;
            } while (uVar67 != uVar40);
LAB_00132ae4:
            _close_queue = 0;
            MemFree(pvVar36);
            DAT_00233e78 = (void *)0x0;
          }
          else {
            bVar26 = IsPopupOpen("Save?",0);
            if (!bVar26) {
              OpenPopup("Save?",0);
            }
            bVar26 = BeginPopupModal("Save?",(bool *)0x0,0);
            if (!bVar26) goto LAB_00132bf9;
            Text("Save change to the following items?");
            SetNextItemWidth(-1.0);
            bVar26 = ListBoxHeader("##",iVar41,6);
            if (bVar26) {
              if (0 < ShowExampleAppDocuments(bool*)::close_queue) {
                lVar43 = 0;
                pvVar36 = DAT_00233e78;
                iVar41 = ShowExampleAppDocuments(bool*)::close_queue;
                do {
                  puVar47 = *(undefined8 **)((long)pvVar36 + lVar43 * 8);
                  if (*(char *)((long)puVar47 + 10) == '\x01') {
                    Text("%s",*puVar47);
                    pvVar36 = DAT_00233e78;
                    iVar41 = ShowExampleAppDocuments(bool*)::close_queue;
                  }
                  lVar43 = lVar43 + 1;
                } while (lVar43 < iVar41);
              }
              ListBoxFooter();
            }
            local_d8._0_4_ = 80.0;
            local_d8._4_4_ = 0.0;
            bVar26 = Button("Yes",(ImVec2 *)local_d8);
            pvVar36 = DAT_00233e78;
            if (bVar26) {
              if ((long)ShowExampleAppDocuments(bool*)::close_queue < 1) {
                if (DAT_00233e78 != (void *)0x0) goto LAB_00132b03;
              }
              else {
                lVar43 = 0;
                do {
                  lVar46 = *(long *)((long)pvVar36 + lVar43 * 8);
                  if (*(char *)(lVar46 + 10) == '\x01') {
                    *(undefined1 *)(lVar46 + 10) = 0;
                  }
                  *(undefined1 *)(lVar46 + 8) = 0;
                  *(undefined1 *)(lVar46 + 10) = 0;
                  lVar43 = lVar43 + 1;
                } while (ShowExampleAppDocuments(bool*)::close_queue != lVar43);
LAB_00132b03:
                _close_queue = 0;
                MemFree(pvVar36);
                DAT_00233e78 = (void *)0x0;
              }
              CloseCurrentPopup();
            }
            SameLine(0.0,-1.0);
            local_d8._0_4_ = 80.0;
            local_d8._4_4_ = 0.0;
            bVar26 = Button("No",(ImVec2 *)local_d8);
            pvVar36 = DAT_00233e78;
            if (bVar26) {
              if ((long)ShowExampleAppDocuments(bool*)::close_queue < 1) {
                if (DAT_00233e78 != (void *)0x0) goto LAB_00132b80;
              }
              else {
                lVar43 = 0;
                do {
                  lVar46 = *(long *)((long)pvVar36 + lVar43 * 8);
                  *(undefined1 *)(lVar46 + 8) = 0;
                  *(undefined1 *)(lVar46 + 10) = 0;
                  lVar43 = lVar43 + 1;
                } while (ShowExampleAppDocuments(bool*)::close_queue != lVar43);
LAB_00132b80:
                _close_queue = 0;
                MemFree(pvVar36);
                DAT_00233e78 = (void *)0x0;
              }
              CloseCurrentPopup();
            }
            SameLine(0.0,-1.0);
            local_d8 = SUB168(ZEXT416(0x42a00000),0);
            bVar26 = Button("Cancel",(ImVec2 *)local_d8);
            if (bVar26) {
              if (DAT_00233e78 != (void *)0x0) {
                _close_queue = 0;
                MemFree(DAT_00233e78);
                DAT_00233e78 = (void *)0x0;
              }
              CloseCurrentPopup();
            }
            EndPopup();
          }
        }
      }
    }
LAB_00132bf9:
    End();
  }
  if (ShowDemoWindow::show_app_console == true) {
    if ((ShowExampleAppConsole(bool*)::console == '\0') &&
       (iVar41 = __cxa_guard_acquire(&ShowExampleAppConsole(bool*)::console), iVar41 != 0)) {
      ExampleAppConsole::ExampleAppConsole
                ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console);
      __cxa_atexit(ExampleAppConsole::~ExampleAppConsole,ShowExampleAppConsole(bool*)::console,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppConsole(bool*)::console);
    }
    ExampleAppConsole::Draw
              ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console,"Example: Console",
               &ShowDemoWindow::show_app_console);
  }
  if (ShowDemoWindow::show_app_log == true) {
    local_58 = p_open;
    if ((ShowExampleAppLog(bool*)::log == '\0') &&
       (iVar41 = __cxa_guard_acquire(&ShowExampleAppLog(bool*)::log), iVar41 != 0)) {
      ExampleAppLog::ExampleAppLog((ExampleAppLog *)ShowExampleAppLog(bool*)::log);
      __cxa_atexit(ExampleAppLog::~ExampleAppLog,ShowExampleAppLog(bool*)::log,&__dso_handle);
      __cxa_guard_release(&ShowExampleAppLog(bool*)::log);
    }
    local_d8._0_4_ = 500.0;
    local_d8._4_4_ = 400.0;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    Begin("Example: Log",&ShowDemoWindow::show_app_log,0);
    bVar26 = SmallButton("[Debug] Add 5 entries");
    if (bVar26) {
      iVar41 = 5;
      do {
        uVar38 = GetFrameCount();
        GetTime();
        ExampleAppLog::AddLog
                  ((ExampleAppLog *)ShowExampleAppLog(bool*)::log,
                   "[%05d] [%s] Hello, current time is %.1f, here\'s a word: \'%s\'\n",(ulong)uVar38
                  );
        ShowExampleAppLog(bool*)::counter = ShowExampleAppLog(bool*)::counter + 1;
        iVar41 = iVar41 + -1;
      } while (iVar41 != 0);
    }
    End();
    ExampleAppLog::Draw((ExampleAppLog *)ShowExampleAppLog(bool*)::log,"Example: Log",
                        &ShowDemoWindow::show_app_log);
    p_open = local_58;
  }
  if (ShowDemoWindow::show_app_layout == true) {
    local_d8._0_4_ = 500.0;
    local_d8._4_4_ = 440.0;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    bVar26 = Begin("Example: Simple layout",&ShowDemoWindow::show_app_layout,0x400);
    if (bVar26) {
      bVar26 = BeginMenuBar();
      if (bVar26) {
        bVar26 = BeginMenu("File",true);
        if (bVar26) {
          bVar26 = MenuItem("Close",(char *)0x0,false,true);
          if (bVar26) {
            ShowDemoWindow::show_app_layout = false;
          }
          EndMenu();
        }
        EndMenuBar();
      }
      local_d8 = SUB168(ZEXT416(0x43160000),0);
      BeginChild("left pane",(ImVec2 *)local_d8,true,0);
      uVar67 = 0;
      do {
        iVar41 = (int)uVar67;
        sprintf((char *)local_d8,"MyObject %d",uVar67);
        local_148.x = 0.0;
        local_148.y = 0.0;
        bVar26 = Selectable((char *)local_d8,iVar41 == ShowExampleAppLayout(bool*)::selected,0,
                            &local_148);
        if (bVar26) {
          ShowExampleAppLayout(bool*)::selected = iVar41;
        }
        uVar67 = (ulong)(iVar41 + 1U);
      } while (iVar41 + 1U != 100);
      EndChild();
      SameLine(0.0,-1.0);
      BeginGroup();
      fVar51 = GetFrameHeightWithSpacing();
      local_d8 = (undefined1  [8])((ulong)((uint)fVar51 ^ (uint)DAT_001bf160) << 0x20);
      BeginChild("item view",(ImVec2 *)local_d8,false,0);
      Text("MyObject: %d");
      Separator();
      bVar26 = BeginTabBar("##Tabs",0);
      if (bVar26) {
        bVar26 = BeginTabItem("Description",(bool *)0x0,0);
        if (bVar26) {
          TextWrapped(
                     "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. "
                     );
          EndTabItem();
        }
        bVar26 = BeginTabItem("Details",(bool *)0x0,0);
        if (bVar26) {
          Text("ID: 0123456789");
          EndTabItem();
        }
        EndTabBar();
      }
      EndChild();
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      Button("Revert",(ImVec2 *)local_d8);
      SameLine(0.0,-1.0);
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      Button("Save",(ImVec2 *)local_d8);
      EndGroup();
    }
    End();
  }
  if (ShowDemoWindow::show_app_property_editor == true) {
    local_d8._0_4_ = 430.0;
    local_d8._4_4_ = 450.0;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    bVar26 = Begin("Example: Property editor",&ShowDemoWindow::show_app_property_editor,0);
    if (bVar26) {
      HelpMarker(
                "This example shows how you may implement a property editor using two columns.\nAll objects/fields data are dummies here.\nRemember that in many simple cases, you can use ImGui::SameLine(xxx) to position\nyour cursor horizontally instead of using the Columns() API."
                );
      local_d8._0_4_ = 2.0;
      local_d8._4_4_ = 2.0;
      PushStyleVar(10,(ImVec2 *)local_d8);
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar26 = BeginTable("split",2,0x501,(ImVec2 *)local_d8,0.0);
      if (bVar26) {
        iVar41 = 0;
        do {
          ShowPlaceholderObject("Object",iVar41);
          iVar41 = iVar41 + 1;
        } while (iVar41 != 4);
        EndTable();
      }
      PopStyleVar(1);
    }
    End();
  }
  if (ShowDemoWindow::show_app_long_text == true) {
    local_d8._0_4_ = 520.0;
    local_d8._4_4_ = 600.0;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    bVar26 = Begin("Example: Long text display",&ShowDemoWindow::show_app_long_text,0);
    if (bVar26) {
      if (ShowExampleAppLongText(bool*)::log == '\0') {
        ShowDemoWindow();
      }
      Text("Printing unusually long amount of text.");
      Combo("Test type",&ShowExampleAppLongText(bool*)::test_type,"Single call to TextUnformatted()"
            ,-1);
      uVar67 = (ulong)(ShowExampleAppLongText(bool*)::log - 1);
      if (ShowExampleAppLongText(bool*)::log == 0) {
        uVar67 = 0;
      }
      Text("Buffer contents: %d lines, %d bytes",(ulong)ShowExampleAppLongText(bool*)::lines,uVar67)
      ;
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar26 = Button("Clear",(ImVec2 *)local_d8);
      if (bVar26) {
        if (DAT_00233de0 != (char *)0x0) {
          _log = 0;
          MemFree(DAT_00233de0);
          DAT_00233de0 = (char *)0x0;
        }
        ShowExampleAppLongText(bool*)::lines = 0;
      }
      SameLine(0.0,-1.0);
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar26 = Button("Add 1000 lines",(ImVec2 *)local_d8);
      if (bVar26) {
        iVar41 = 0;
        do {
          ImGuiTextBuffer::appendf
                    ((ImGuiTextBuffer *)&ShowExampleAppLongText(bool*)::log,
                     "%i The quick brown fox jumps over the lazy dog\n",
                     (ulong)(ShowExampleAppLongText(bool*)::lines + iVar41));
          iVar41 = iVar41 + 1;
        } while (iVar41 != 1000);
        ShowExampleAppLongText(bool*)::lines = ShowExampleAppLongText(bool*)::lines + 1000;
      }
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      BeginChild("Log",(ImVec2 *)local_d8,false,0);
      if (ShowExampleAppLongText(bool*)::test_type == 2) {
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        PushStyleVar(0xd,(ImVec2 *)local_d8);
        if (0 < (int)ShowExampleAppLongText(bool*)::lines) {
          uVar67 = 0;
          do {
            Text("%i The quick brown fox jumps over the lazy dog",uVar67);
            uVar38 = (int)uVar67 + 1;
            uVar67 = (ulong)uVar38;
          } while ((int)uVar38 < (int)ShowExampleAppLongText(bool*)::lines);
        }
        PopStyleVar(1);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 1) {
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        PushStyleVar(0xd,(ImVec2 *)local_d8);
        ImGuiListClipper::ImGuiListClipper((ImGuiListClipper *)local_d8);
        ImGuiListClipper::Begin
                  ((ImGuiListClipper *)local_d8,ShowExampleAppLongText(bool*)::lines,-1.0);
        while (bVar26 = ImGuiListClipper::Step((ImGuiListClipper *)local_d8), bVar26) {
          fVar51 = (float)local_d8._0_4_;
          while( true ) {
            if ((int)local_d8._4_4_ <= (int)fVar51) break;
            Text("%i The quick brown fox jumps over the lazy dog",(ulong)(uint)fVar51);
            fVar51 = (float)((int)fVar51 + 1);
          }
        }
        PopStyleVar(1);
        ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)local_d8);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 0) {
        if (DAT_00233de0 == (char *)0x0) {
          pcVar45 = ImGuiTextBuffer::EmptyString;
          pcVar44 = ImGuiTextBuffer::EmptyString;
        }
        else {
          if ((long)ShowExampleAppLongText(bool*)::log < 1) {
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.h"
                          ,0x665,"const T &ImVector<char>::front() const [T = char]");
          }
          pcVar44 = DAT_00233de0 + (long)ShowExampleAppLongText(bool*)::log + -1;
          pcVar45 = DAT_00233de0;
        }
        TextUnformatted(pcVar45,pcVar44);
      }
      EndChild();
    }
    End();
  }
  if (ShowDemoWindow::show_app_auto_resize == true) {
    bVar26 = Begin("Example: Auto-resizing window",&ShowDemoWindow::show_app_auto_resize,0x40);
    if (bVar26) {
      TextUnformatted("Window will resize every-frame to the size of its content.\nNote that you probably don\'t want to query the window size to\noutput your content because that would create a feedback loop."
                      ,(char *)0x0);
      SliderInt("Number of lines",&ShowExampleAppAutoResize(bool*)::lines,1,0x14,"%d",0);
      if (0 < ShowExampleAppAutoResize(bool*)::lines) {
        uVar67 = 0;
        iVar41 = 0;
        do {
          Text("%*sThis is line %d",uVar67,"");
          iVar41 = iVar41 + 1;
          uVar67 = (ulong)((int)uVar67 + 4);
        } while (iVar41 < ShowExampleAppAutoResize(bool*)::lines);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_constrained_resize == true) {
    local_a8 = "Custom: Fixed Steps (100)";
    local_b8 = "Height 400-500";
    pcStack_b0 = "Custom: Always Square";
    local_c8 = (ImVec2)0x1cfb3a;
    IStack_c0 = (ImVec2)0x1cfb54;
    local_d8 = (undefined1  [8])0x1cfb0e;
    IStack_d0 = (ImVec2)0x1cfb23;
    if (ShowExampleAppConstrainedResize(bool*)::type == 0) {
      local_148.x = -1.0;
      local_148.y = 0.0;
      local_110.x = -1.0;
      local_110.y = 3.4028235e+38;
      SetNextWindowSizeConstraints(&local_148,&local_110,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 1) {
      local_148.x = 0.0;
      local_148.y = -1.0;
      local_110.x = 3.4028235e+38;
      local_110.y = -1.0;
      SetNextWindowSizeConstraints(&local_148,&local_110,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 2) {
      local_148.x = 100.0;
      local_148.y = 100.0;
      local_110.x = 3.4028235e+38;
      local_110.y = 3.4028235e+38;
      SetNextWindowSizeConstraints(&local_148,&local_110,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 3) {
      local_148.x = 400.0;
      local_148.y = -1.0;
      local_110.x = 500.0;
      local_110.y = -1.0;
      SetNextWindowSizeConstraints(&local_148,&local_110,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 4) {
      local_148.x = -1.0;
      local_148.y = 400.0;
      local_110.x = -1.0;
      local_110.y = 500.0;
      SetNextWindowSizeConstraints(&local_148,&local_110,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 5) {
      local_148.x = 0.0;
      local_148.y = 0.0;
      local_110.x = 3.4028235e+38;
      local_110.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                (&local_148,&local_110,ShowExampleAppConstrainedResize::CustomConstraints::Square,
                 (void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 6) {
      local_148.x = 0.0;
      local_148.y = 0.0;
      local_110.x = 3.4028235e+38;
      local_110.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                (&local_148,&local_110,ShowExampleAppConstrainedResize::CustomConstraints::Step,
                 (void *)0x64);
    }
    bVar26 = Begin("Example: Constrained Resize",&ShowDemoWindow::show_app_constrained_resize,
                   (uint)ShowExampleAppConstrainedResize(bool*)::auto_resize << 6);
    if (bVar26) {
      local_148.x = 0.0;
      local_148.y = 0.0;
      bVar26 = Button("200x200",&local_148);
      if (bVar26) {
        local_148.x = 200.0;
        local_148.y = 200.0;
        SetWindowSize(&local_148,0);
      }
      SameLine(0.0,-1.0);
      local_148.x = 0.0;
      local_148.y = 0.0;
      bVar26 = Button("500x500",&local_148);
      if (bVar26) {
        local_148.x = 500.0;
        local_148.y = 500.0;
        SetWindowSize(&local_148,0);
      }
      SameLine(0.0,-1.0);
      local_148.x = 0.0;
      local_148.y = 0.0;
      bVar26 = Button("800x200",&local_148);
      if (bVar26) {
        local_148.x = 800.0;
        local_148.y = 200.0;
        SetWindowSize(&local_148,0);
      }
      SetNextItemWidth(200.0);
      Combo("Constraint",&ShowExampleAppConstrainedResize(bool*)::type,(char **)local_d8,7,-1);
      SetNextItemWidth(200.0);
      DragInt("Lines",&ShowExampleAppConstrainedResize(bool*)::display_lines,0.2,1,100,"%d",0);
      Checkbox("Auto-resize",(bool *)&ShowExampleAppConstrainedResize(bool*)::auto_resize);
      if (0 < ShowExampleAppConstrainedResize(bool*)::display_lines) {
        uVar67 = 0;
        iVar41 = 0;
        do {
          Text("%*sHello, sailor! Making this line long enough for the example.",uVar67,"");
          iVar41 = iVar41 + 1;
          uVar67 = (ulong)((int)uVar67 + 4);
        } while (iVar41 < ShowExampleAppConstrainedResize(bool*)::display_lines);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_simple_overlay == true) {
    pIVar33 = GetIO();
    if (ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff) {
      flags = 0xc116b;
    }
    else {
      uVar67 = CONCAT44(-(uint)((ShowExampleAppSimpleOverlay(bool*)::corner & 2) == 0),
                        -(uint)((ShowExampleAppSimpleOverlay(bool*)::corner & 1) == 0));
      local_d8 = (undefined1  [8])
                 ((ulong)DAT_001c4cb0 & uVar67 |
                 ~uVar67 & CONCAT44((pIVar33->DisplaySize).y + -10.0,
                                    (pIVar33->DisplaySize).x + -10.0));
      uVar67 = ~uVar67 & DAT_001bf1a0;
      local_148.x = (float)uVar67;
      local_148.y = (float)(uVar67 >> 0x20);
      SetNextWindowPos((ImVec2 *)local_d8,1,&local_148);
      flags = 0xc116f;
    }
    SetNextWindowBgAlpha(0.35);
    bVar26 = Begin("Example: Simple overlay",&ShowDemoWindow::show_app_simple_overlay,flags);
    if (bVar26) {
      Text("Simple overlay\nin the corner of the screen.\n(right-click to change position)");
      Separator();
      bVar26 = IsMousePosValid((ImVec2 *)0x0);
      if (bVar26) {
        Text("Mouse Position: (%.1f,%.1f)",(double)(pIVar33->MousePos).x);
      }
      else {
        Text("Mouse Position: <invalid>");
      }
      bVar26 = BeginPopupContextWindow((char *)0x0,1);
      if (bVar26) {
        bVar26 = MenuItem("Custom",(char *)0x0,
                          ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff,true);
        uVar38 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar26) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0xffffffff;
        }
        bVar26 = MenuItem("Top-left",(char *)0x0,!bVar26 && uVar38 == 0,true);
        uVar38 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar26) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0;
        }
        bVar26 = MenuItem("Top-right",(char *)0x0,!bVar26 && uVar38 == 1,true);
        uVar38 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar26) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 1;
        }
        bVar26 = MenuItem("Bottom-left",(char *)0x0,!bVar26 && uVar38 == 2,true);
        uVar38 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar26) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 2;
        }
        bVar26 = MenuItem("Bottom-right",(char *)0x0,!bVar26 && uVar38 == 3,true);
        if (bVar26) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 3;
        }
        bVar26 = MenuItem("Close",(char *)0x0,false,true);
        if (bVar26) {
          ShowDemoWindow::show_app_simple_overlay = false;
        }
        EndPopup();
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_window_titles == true) {
    local_d8._0_4_ = 100.0;
    local_d8._4_4_ = 100.0;
    local_148.x = 0.0;
    local_148.y = 0.0;
    SetNextWindowPos((ImVec2 *)local_d8,4,&local_148);
    Begin("Same title as another window##1",(bool *)0x0,0);
    Text("This is window 1.\nMy title is the same as window 2, but my identifier is unique.");
    End();
    local_d8._0_4_ = 100.0;
    local_d8._4_4_ = 200.0;
    local_148.x = 0.0;
    local_148.y = 0.0;
    SetNextWindowPos((ImVec2 *)local_d8,4,&local_148);
    Begin("Same title as another window##2",(bool *)0x0,0);
    Text("This is window 2.\nMy title is the same as window 1, but my identifier is unique.");
    End();
    dVar54 = GetTime();
    cVar37 = "|/-\\"[(int)(dVar54 * 4.0) & 3];
    GetFrameCount();
    sprintf(local_d8,"Animated title %c %d###AnimatedTitle",(ulong)(uint)(int)cVar37);
    local_148.x = 100.0;
    local_148.y = 300.0;
    local_110.x = 0.0;
    local_110.y = 0.0;
    SetNextWindowPos(&local_148,4,&local_110);
    Begin(local_d8,(bool *)0x0,0);
    Text("This window has a changing title.");
    End();
  }
  if (ShowDemoWindow::show_app_custom_rendering != true) goto LAB_00134eb0;
  bVar26 = Begin("Example: Custom rendering",&ShowDemoWindow::show_app_custom_rendering,0);
  if ((bVar26) && (bVar26 = BeginTabBar("##TabBar",0), bVar26)) {
    bVar26 = BeginTabItem("Primitives",(bool *)0x0,0);
    if (bVar26) {
      local_58 = p_open;
      fVar51 = GetFontSize();
      PushItemWidth(fVar51 * -15.0);
      pIVar34 = GetWindowDrawList();
      Text("Gradients");
      fVar51 = CalcItemWidth();
      local_128._0_4_ = GetFrameHeight();
      local_128._4_4_ = extraout_XMM0_Db;
      uStack_120._0_4_ = extraout_XMM0_Dc;
      uStack_120._4_4_ = extraout_XMM0_Dd;
      local_110.y = (float)local_128._0_4_;
      local_110.x = fVar51;
      local_d8 = (undefined1  [8])GetCursorScreenPos();
      local_148.x = fVar51 + local_d8._0_4_;
      local_148.y = (float)local_128._0_4_ + local_d8._4_4_;
      IVar29 = GetColorU32(0xff000000);
      IVar30 = GetColorU32(0xffffffff);
      ImDrawList::AddRectFilledMultiColor
                (pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,IVar30,IVar30,IVar29);
      InvisibleButton("##gradient1",&local_110,0);
      local_d8 = (undefined1  [8])GetCursorScreenPos();
      local_148.x = local_110.x + local_d8._0_4_;
      local_148.y = local_110.y + local_d8._4_4_;
      IVar29 = GetColorU32(0xff00ff00);
      IVar30 = GetColorU32(0xff0000ff);
      ImDrawList::AddRectFilledMultiColor
                (pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,IVar30,IVar30,IVar29);
      InvisibleButton("##gradient2",&local_110,0);
      Text("All primitives");
      if (ShowExampleAppCustomRendering(bool*)::colf == '\0') {
        ShowDemoWindow();
      }
      DragFloat("Size",&ShowExampleAppCustomRendering(bool*)::sz,0.2,2.0,72.0,"%.0f",0);
      DragFloat("Thickness",&ShowExampleAppCustomRendering(bool*)::thickness,0.05,1.0,8.0,"%.02f",0)
      ;
      SliderInt("N-gon sides",&ShowExampleAppCustomRendering(bool*)::ngon_sides,3,0xc,"%d",0);
      Checkbox("##circlesegmentoverride",
               (bool *)&ShowExampleAppCustomRendering(bool*)::circle_segments_override);
      pIVar35 = GetStyle();
      SameLine(0.0,(pIVar35->ItemInnerSpacing).x);
      bVar26 = SliderInt("Circle segments override",
                         &ShowExampleAppCustomRendering(bool*)::circle_segments_override_v,3,0x28,
                         "%d",0);
      ShowExampleAppCustomRendering(bool*)::circle_segments_override =
           ShowExampleAppCustomRendering(bool*)::circle_segments_override | bVar26;
      Checkbox("##curvessegmentoverride",
               (bool *)&ShowExampleAppCustomRendering(bool*)::curve_segments_override);
      pIVar35 = GetStyle();
      SameLine(0.0,(pIVar35->ItemInnerSpacing).x);
      bVar26 = SliderInt("Curves segments override",
                         &ShowExampleAppCustomRendering(bool*)::curve_segments_override_v,3,0x28,
                         "%d",0);
      ShowExampleAppCustomRendering(bool*)::curve_segments_override =
           ShowExampleAppCustomRendering(bool*)::curve_segments_override | bVar26;
      ColorEdit4("Color",(float *)ShowExampleAppCustomRendering(bool*)::colf,0);
      IVar55 = GetCursorScreenPos();
      local_d8 = (undefined1  [8])ShowExampleAppCustomRendering(bool*)::colf._0_8_;
      IStack_d0.x = (float)ShowExampleAppCustomRendering(bool*)::colf._8_4_;
      IStack_d0.y = (float)ShowExampleAppCustomRendering(bool*)::colf._12_4_;
      IVar29 = ColorConvertFloat4ToU32((ImVec4 *)local_d8);
      local_dc = 0;
      if (ShowExampleAppCustomRendering(bool*)::circle_segments_override != 0) {
        local_dc = ShowExampleAppCustomRendering(bool*)::circle_segments_override_v;
      }
      iVar41 = 0;
      if (ShowExampleAppCustomRendering(bool*)::curve_segments_override != 0) {
        iVar41 = ShowExampleAppCustomRendering(bool*)::curve_segments_override_v;
      }
      local_158 = IVar55.x;
      fStack_154 = IVar55.y;
      uStack_14c = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
      local_48.x = local_158 + 4.0;
      local_48.y = fStack_154;
      uStack_40._0_4_ = (undefined4)extraout_XMM0_Qb;
      uStack_40._4_4_ = uStack_14c;
      fVar51 = fStack_154 + 4.0;
      bVar26 = true;
      do {
        bVar27 = bVar26;
        fVar53 = 1.0;
        if (!bVar27) {
          fVar53 = ShowExampleAppCustomRendering(bool*)::thickness;
        }
        local_128._0_4_ = fVar53;
        fVar52 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
        local_d8._0_4_ = fVar52 + local_48.x;
        local_d8._4_4_ = fVar52 + fVar51;
        ImDrawList::AddNgon(pIVar34,(ImVec2 *)local_d8,fVar52,IVar29,
                            ShowExampleAppCustomRendering(bool*)::ngon_sides,fVar53);
        fVar52 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_48.x;
        _local_108 = ZEXT416((uint)fVar52);
        fVar53 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
        local_d8._0_4_ = fVar53 + fVar52;
        local_d8._4_4_ = fVar53 + fVar51;
        ImDrawList::AddCircle
                  (pIVar34,(ImVec2 *)local_d8,fVar53,IVar29,local_dc,(float)local_128._0_4_);
        local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
        _local_108 = ZEXT416((uint)local_d8._0_4_);
        local_d8._4_4_ = fVar51;
        local_148.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
        local_148.y = fVar51 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRect(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,0.0,0,
                            (float)local_128._0_4_);
        local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
        _local_108 = ZEXT416((uint)local_d8._0_4_);
        local_148.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
        local_148.y = fVar51 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRect(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,10.0,0xf,
                            (float)local_128._0_4_);
        local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
        _local_108 = ZEXT416((uint)local_d8._0_4_);
        local_148.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
        local_148.y = fVar51 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRect(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,10.0,9,
                            (float)local_128._0_4_);
        local_108._0_4_ = (float)local_108._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
        local_148.y = ShowExampleAppCustomRendering(bool*)::sz + fVar51 + -0.5;
        local_108._4_4_ = local_148.y;
        uStack_100._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 0.0 + 0.0;
        uStack_100._4_4_ = ShowExampleAppCustomRendering(bool*)::sz + fStack_154 + 0.0;
        local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + (float)local_108._0_4_;
        local_148.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_108._0_4_;
        local_50.y = local_148.y;
        local_50.x = (float)local_108._0_4_;
        ImDrawList::AddTriangle
                  (pIVar34,(ImVec2 *)local_d8,&local_148,&local_50,IVar29,(float)local_128._0_4_);
        local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
        _local_108 = ZEXT416((uint)local_d8._0_4_);
        local_148.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_d8._0_4_;
        local_148.y = fVar51;
        ImDrawList::AddLine(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,(float)local_128._0_4_);
        local_148.x = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
        local_148.y = ShowExampleAppCustomRendering(bool*)::sz + fVar51;
        uStack_100._0_4_ = (float)local_108._4_4_ + 0.0;
        local_108._4_4_ = local_148.y;
        local_108._0_4_ = local_148.x;
        uStack_100._4_4_ = fStack_154 + 0.0;
        local_d8._0_4_ = local_148.x;
        ImDrawList::AddLine(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,(float)local_128._0_4_);
        local_108._0_4_ = (float)local_108._0_4_ + 10.0;
        local_d8._0_4_ = local_108._0_4_;
        local_148.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_108._0_4_;
        local_148.y = ShowExampleAppCustomRendering(bool*)::sz + fVar51;
        ImDrawList::AddLine(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,(float)local_128._0_4_);
        local_148.x = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
        _local_108 = ZEXT416((uint)local_148.x);
        local_140.y = ShowExampleAppCustomRendering(bool*)::sz * -0.4 + fVar51;
        local_138[0].x = local_148.x + ShowExampleAppCustomRendering(bool*)::sz;
        local_138[0].y = fVar51 + ShowExampleAppCustomRendering(bool*)::sz;
        local_148.y = ShowExampleAppCustomRendering(bool*)::sz * 0.6 + fVar51;
        local_140.x = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + local_148.x;
        ImDrawList::AddBezierQuadratic
                  (pIVar34,&local_148,&local_140,local_138,IVar29,(float)local_128._0_4_,iVar41);
        local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
        IStack_d0.y = ShowExampleAppCustomRendering(bool*)::sz * 0.3 + fVar51;
        IStack_d0.x = ShowExampleAppCustomRendering(bool*)::sz * 1.3 + (float)local_d8._0_4_;
        local_c8.y = -ShowExampleAppCustomRendering(bool*)::sz * 0.3 +
                     fVar51 + ShowExampleAppCustomRendering(bool*)::sz;
        local_c8.x = -ShowExampleAppCustomRendering(bool*)::sz * 1.3 +
                     ShowExampleAppCustomRendering(bool*)::sz + (float)local_d8._0_4_;
        IStack_c0.y = fVar51 + ShowExampleAppCustomRendering(bool*)::sz;
        IStack_c0.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_d8._0_4_;
        ImDrawList::AddBezierCubic
                  (pIVar34,(ImVec2 *)local_d8,&IStack_d0,&local_c8,&IStack_c0,IVar29,
                   (float)local_128._0_4_,iVar41);
        fVar51 = fVar51 + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
        bVar26 = false;
      } while (bVar27);
      fVar53 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
      local_d8._0_4_ = fVar53 + local_48.x;
      local_d8._4_4_ = fVar53 + fVar51;
      ImDrawList::AddNgonFilled
                (pIVar34,(ImVec2 *)local_d8,fVar53,IVar29,
                 ShowExampleAppCustomRendering(bool*)::ngon_sides);
      local_48.x = local_48.x + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
      fVar53 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
      local_d8._0_4_ = fVar53 + local_48.x;
      local_d8._4_4_ = fVar53 + fVar51;
      ImDrawList::AddCircleFilled(pIVar34,(ImVec2 *)local_d8,fVar53,IVar29,local_dc);
      local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_48.x;
      _local_128 = ZEXT416((uint)local_d8._0_4_);
      local_d8._4_4_ = fVar51;
      local_148.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
      local_148.y = fVar51 + ShowExampleAppCustomRendering(bool*)::sz;
      ImDrawList::AddRectFilled(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,0.0,0xf);
      local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
      _local_128 = ZEXT416((uint)local_d8._0_4_);
      local_148.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
      local_148.y = fVar51 + ShowExampleAppCustomRendering(bool*)::sz;
      ImDrawList::AddRectFilled(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,10.0,0xf);
      local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
      _local_128 = ZEXT416((uint)local_d8._0_4_);
      local_148.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
      local_148.y = fVar51 + ShowExampleAppCustomRendering(bool*)::sz;
      ImDrawList::AddRectFilled(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,10.0,9);
      local_128._0_4_ = (float)local_128._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
      local_148.y = ShowExampleAppCustomRendering(bool*)::sz + fVar51 + -0.5;
      local_128._4_4_ = local_148.y;
      uStack_120._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 0.0 + 0.0;
      uStack_120._4_4_ = ShowExampleAppCustomRendering(bool*)::sz + fStack_154 + 0.0;
      local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + (float)local_128._0_4_;
      local_148.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_128._0_4_;
      local_50.y = local_148.y;
      local_50.x = (float)local_128._0_4_;
      ImDrawList::AddTriangleFilled(pIVar34,(ImVec2 *)local_d8,&local_148,&local_50,IVar29);
      local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
      _local_128 = ZEXT416((uint)local_d8._0_4_);
      local_148.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
      local_148.y = ShowExampleAppCustomRendering(bool*)::thickness + fVar51;
      ImDrawList::AddRectFilled(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,0.0,0xf);
      local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
      _local_128 = ZEXT416((uint)local_d8._0_4_);
      local_148.x = ShowExampleAppCustomRendering(bool*)::thickness + (float)local_d8._0_4_;
      local_148.y = ShowExampleAppCustomRendering(bool*)::sz + fVar51;
      ImDrawList::AddRectFilled(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,0.0,0xf);
      local_128._0_4_ = (float)local_128._0_4_ + 20.0;
      local_d8._0_4_ = local_128._0_4_;
      local_148.x = (float)local_128._0_4_ + 1.0;
      local_148.y = fVar51 + 1.0;
      ImDrawList::AddRectFilled(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,0.0,0xf);
      local_d8._0_4_ = (float)local_128._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
      local_148.x = (float)local_128._0_4_ + ShowExampleAppCustomRendering(bool*)::sz +
                    ShowExampleAppCustomRendering(bool*)::sz;
      local_148.y = fVar51 + ShowExampleAppCustomRendering(bool*)::sz;
      ImDrawList::AddRectFilledMultiColor
                (pIVar34,(ImVec2 *)local_d8,&local_148,0xff000000,0xff0000ff,0xff00ffff,0xff00ff00);
      local_d8._0_4_ = (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 10.2;
      local_d8._4_4_ = (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 3.0;
      Dummy((ImVec2 *)local_d8);
      PopItemWidth();
      EndTabItem();
      p_open = local_58;
    }
    bVar26 = BeginTabItem("Canvas",(bool *)0x0,0);
    if (bVar26) {
      if (ShowExampleAppCustomRendering(bool*)::points == '\0') {
        ShowDemoWindow();
      }
      if (ShowExampleAppCustomRendering(bool*)::scrolling == '\0') {
        ShowDemoWindow();
      }
      Checkbox("Enable grid",(bool *)&ShowExampleAppCustomRendering(bool*)::opt_enable_grid);
      Checkbox("Enable context menu",
               (bool *)&ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu);
      Text("Mouse Left: drag to add lines,\nMouse Right: drag to scroll, click for context menu.");
      local_d8 = (undefined1  [8])GetCursorScreenPos();
      IVar55 = GetContentRegionAvail();
      local_148.x = IVar55.x;
      local_148.y = IVar55.y;
      if (local_148.x < 50.0) {
        local_148.x = 50.0;
        IVar55.x = 50.0;
        IVar55.y = 0.0;
      }
      if (local_148.y < 50.0) {
        local_148.y = 50.0;
      }
      local_110.x = local_d8._0_4_ + IVar55.x;
      local_110.y = local_d8._4_4_ + local_148.y;
      pIVar33 = GetIO();
      pIVar34 = GetWindowDrawList();
      ImDrawList::AddRectFilled(pIVar34,(ImVec2 *)local_d8,&local_110,0xff323232,0.0,0xf);
      ImDrawList::AddRect(pIVar34,(ImVec2 *)local_d8,&local_110,0xffffffff,0.0,0xf,1.0);
      InvisibleButton("canvas",&local_148,3);
      bVar26 = IsItemHovered(0);
      bVar27 = IsItemActive();
      fVar51 = _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0 + local_d8._0_4_;
      fVar53 = _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1 + local_d8._4_4_;
      local_50.x = (pIVar33->MousePos).x - fVar51;
      local_50.y = (pIVar33->MousePos).y - fVar53;
      if (bVar26) {
        if (ShowExampleAppCustomRendering(bool*)::adding_line == '\0') {
          bVar26 = IsMouseClicked(0,false);
          if (!bVar26) goto LAB_00134905;
          ImVector<ImVec2>::push_back
                    ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_50);
          ImVector<ImVec2>::push_back
                    ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_50);
          ShowExampleAppCustomRendering(bool*)::adding_line = '\x01';
        }
LAB_0013490e:
        if ((long)(int)ShowExampleAppCustomRendering(bool*)::points < 1) {
          __assert_fail("Size > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.h"
                        ,0x666,"T &ImVector<ImVec2>::back() [T = ImVec2]");
        }
        *(ImVec2 *)
         ((long)DAT_00233e30 + (long)(int)ShowExampleAppCustomRendering(bool*)::points * 8 + -8) =
             local_50;
        bVar26 = IsMouseDown(0);
        if (!bVar26) {
          ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
        }
      }
      else {
LAB_00134905:
        if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') goto LAB_0013490e;
      }
      if (bVar27) {
        if (ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu == '\0') {
          fVar52 = 0.0;
        }
        else {
          fVar52 = -1.0;
        }
        bVar26 = IsMouseDragging(1,fVar52);
        if (bVar26) {
          _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0 =
               (pIVar33->MouseDelta).x + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0;
          _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1 =
               (pIVar33->MouseDelta).y + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1;
        }
      }
      IVar55 = GetMouseDragDelta(1,-1.0);
      if (ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu == '\x01') {
        uStack_120 = extraout_XMM0_Qb_00;
        local_128._0_4_ = IVar55.x;
        local_128._4_4_ = IVar55.y;
        bVar26 = IsMouseReleased(1);
        if ((((bVar26) && ((float)local_128._0_4_ == 0.0)) && ((float)local_128._4_4_ == 0.0)) &&
           (!NAN((float)local_128._4_4_))) {
          OpenPopupOnItemClick("context",1);
        }
      }
      bVar26 = BeginPopup("context",0);
      if (bVar26) {
        uVar38 = ShowExampleAppCustomRendering(bool*)::points;
        if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') {
          uVar38 = ShowExampleAppCustomRendering(bool*)::points - 2;
          if (DAT_00233e2c < (int)uVar38) {
            if (DAT_00233e2c == 0) {
              uVar48 = 8;
            }
            else {
              uVar48 = DAT_00233e2c / 2 + DAT_00233e2c;
            }
            if ((int)uVar48 <= (int)uVar38) {
              uVar48 = uVar38;
            }
            pvVar36 = MemAlloc((long)(int)uVar48 << 3);
            if (DAT_00233e30 != (void *)0x0) {
              memcpy(pvVar36,DAT_00233e30,
                     (long)(int)ShowExampleAppCustomRendering(bool*)::points << 3);
              MemFree(DAT_00233e30);
            }
            _points = (ulong)uVar48 << 0x20;
            DAT_00233e30 = pvVar36;
          }
          _points = CONCAT44(DAT_00233e2c,uVar38);
        }
        ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
        bVar26 = MenuItem("Remove one",(char *)0x0,false,0 < (int)uVar38);
        uVar38 = ShowExampleAppCustomRendering(bool*)::points;
        if (bVar26) {
          uVar38 = ShowExampleAppCustomRendering(bool*)::points - 2;
          if (DAT_00233e2c < (int)uVar38) {
            if (DAT_00233e2c == 0) {
              uVar48 = 8;
            }
            else {
              uVar48 = DAT_00233e2c / 2 + DAT_00233e2c;
            }
            if ((int)uVar48 <= (int)uVar38) {
              uVar48 = uVar38;
            }
            pvVar36 = MemAlloc((long)(int)uVar48 << 3);
            if (DAT_00233e30 != (void *)0x0) {
              memcpy(pvVar36,DAT_00233e30,
                     (long)(int)ShowExampleAppCustomRendering(bool*)::points << 3);
              MemFree(DAT_00233e30);
            }
            _points = (ulong)uVar48 << 0x20;
            DAT_00233e30 = pvVar36;
          }
          _points = CONCAT44(DAT_00233e2c,uVar38);
        }
        bVar26 = MenuItem("Remove all",(char *)0x0,false,0 < (int)uVar38);
        if ((bVar26) && (DAT_00233e30 != (void *)0x0)) {
          _points = 0;
          MemFree(DAT_00233e30);
          DAT_00233e30 = (void *)0x0;
        }
        EndPopup();
      }
      ImDrawList::PushClipRect(pIVar34,(ImVec2)local_d8,local_110,true);
      if (ShowExampleAppCustomRendering(bool*)::opt_enable_grid == '\x01') {
        fVar52 = fmodf(_ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0,64.0);
        if (fVar52 < local_148.x) {
          do {
            local_128._0_4_ = fVar52;
            local_e8.y = (float)local_d8._4_4_;
            local_e8.x = (float)local_d8._0_4_ + fVar52;
            local_f0.y = local_110.y;
            local_f0.x = (float)local_d8._0_4_ + fVar52;
            ImDrawList::AddLine(pIVar34,&local_e8,&local_f0,0x28c8c8c8,1.0);
            fVar52 = (float)local_128._0_4_ + 64.0;
          } while (fVar52 < local_148.x);
        }
        fVar52 = fmodf(_ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1,64.0);
        if (fVar52 < local_148.y) {
          do {
            local_128._0_4_ = fVar52;
            local_e8.y = (float)local_d8._4_4_ + fVar52;
            local_e8.x = local_d8._0_4_;
            local_f0.y = (float)local_d8._4_4_ + fVar52;
            local_f0.x = local_110.x;
            ImDrawList::AddLine(pIVar34,&local_e8,&local_f0,0x28c8c8c8,1.0);
            fVar52 = (float)local_128._0_4_ + 64.0;
          } while (fVar52 < local_148.y);
        }
      }
      if (0 < (int)ShowExampleAppCustomRendering(bool*)::points) {
        lVar43 = 1;
        do {
          uVar1 = *(undefined8 *)((long)DAT_00233e30 + lVar43 * 8 + -8);
          local_e8.x = (float)uVar1 + fVar51;
          local_e8.y = (float)((ulong)uVar1 >> 0x20) + fVar53;
          if ((int)ShowExampleAppCustomRendering(bool*)::points <= lVar43) {
            __assert_fail("i >= 0 && i < Size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.h"
                          ,0x65c,"T &ImVector<ImVec2>::operator[](int) [T = ImVec2]");
          }
          uVar1 = *(undefined8 *)((long)DAT_00233e30 + lVar43 * 8);
          local_f0.x = (float)uVar1 + fVar51;
          local_f0.y = (float)((ulong)uVar1 >> 0x20) + fVar53;
          ImDrawList::AddLine(pIVar34,&local_e8,&local_f0,0xff00ffff,2.0);
          iVar41 = (int)lVar43;
          lVar43 = lVar43 + 2;
        } while (iVar41 + 1 < (int)ShowExampleAppCustomRendering(bool*)::points);
      }
      ImDrawList::PopClipRect(pIVar34);
      EndTabItem();
    }
    bVar26 = BeginTabItem("BG/FG draw lists",(bool *)0x0,0);
    if (bVar26) {
      Checkbox("Draw in Background draw list",(bool *)&ShowExampleAppCustomRendering(bool*)::draw_bg
              );
      SameLine(0.0,-1.0);
      HelpMarker("The Background draw list will be rendered below every Dear ImGui windows.");
      Checkbox("Draw in Foreground draw list",(bool *)&ShowExampleAppCustomRendering(bool*)::draw_fg
              );
      SameLine(0.0,-1.0);
      HelpMarker("The Foreground draw list will be rendered over every Dear ImGui windows.");
      IVar55 = GetWindowPos();
      uStack_120 = extraout_XMM0_Qb_01;
      local_128._0_4_ = IVar55.x;
      local_128._4_4_ = IVar55.y;
      IVar55 = GetWindowSize();
      local_d8._0_4_ = IVar55.x * 0.5 + (float)local_128._0_4_;
      local_d8._4_4_ = IVar55.y * 0.5 + (float)local_128._4_4_;
      if (ShowExampleAppCustomRendering(bool*)::draw_bg == '\x01') {
        pIVar34 = GetBackgroundDrawList();
        ImDrawList::AddCircle(pIVar34,(ImVec2 *)local_d8,IVar55.x * 0.6,0xc80000ff,0,14.0);
      }
      if (ShowExampleAppCustomRendering(bool*)::draw_fg == '\x01') {
        pIVar34 = GetForegroundDrawList();
        ImDrawList::AddCircle(pIVar34,(ImVec2 *)local_d8,IVar55.y * 0.6,0xc800ff00,0,10.0);
      }
      EndTabItem();
    }
    EndTabBar();
  }
  End();
LAB_00134eb0:
  if (ShowDemoWindow::show_app_metrics == true) {
    ShowMetricsWindow(&ShowDemoWindow::show_app_metrics);
  }
  if (ShowDemoWindow::show_app_about == true) {
    ShowAboutWindow(&ShowDemoWindow::show_app_about);
  }
  if (ShowDemoWindow::show_app_style_editor == true) {
    Begin("Dear ImGui Style Editor",&ShowDemoWindow::show_app_style_editor,0);
    ShowStyleEditor((ImGuiStyle *)0x0);
    End();
  }
  uVar38 = ShowDemoWindow::no_titlebar + 8;
  if (ShowDemoWindow::no_scrollbar == false) {
    uVar38 = (uint)ShowDemoWindow::no_titlebar;
  }
  uVar48 = uVar38 + 0x400;
  if (ShowDemoWindow::no_menu != false) {
    uVar48 = uVar38;
  }
  uVar38 = uVar48 + 4;
  if (ShowDemoWindow::no_move == false) {
    uVar38 = uVar48;
  }
  uVar48 = uVar38 | 2;
  if (ShowDemoWindow::no_resize == false) {
    uVar48 = uVar38;
  }
  uVar38 = uVar48 | 0x20;
  if (ShowDemoWindow::no_collapse == false) {
    uVar38 = uVar48;
  }
  uVar48 = uVar38 | 0xc0000;
  if (ShowDemoWindow::no_nav == false) {
    uVar48 = uVar38;
  }
  uVar38 = uVar48 | 0x80;
  if (ShowDemoWindow::no_background == false) {
    uVar38 = uVar48;
  }
  uVar48 = uVar38 | 0x2000;
  if (ShowDemoWindow::no_bring_to_front == false) {
    uVar48 = uVar38;
  }
  if (ShowDemoWindow::no_close != false) {
    p_open = (bool *)0x0;
  }
  local_d8._0_4_ = 650.0;
  local_d8._4_4_ = 20.0;
  local_148.x = 0.0;
  local_148.y = 0.0;
  SetNextWindowPos((ImVec2 *)local_d8,4,&local_148);
  local_d8._0_4_ = 550.0;
  local_d8._4_4_ = 680.0;
  SetNextWindowSize((ImVec2 *)local_d8,4);
  bVar26 = Begin("Dear ImGui Demo",p_open,uVar48);
  if (bVar26) {
    fVar51 = GetFontSize();
    PushItemWidth(fVar51 * -12.0);
    bVar26 = BeginMenuBar();
    if (bVar26) {
      bVar26 = BeginMenu("Menu",true);
      if (bVar26) {
        ShowExampleMenuFile();
        EndMenu();
      }
      bVar26 = BeginMenu("Examples",true);
      if (bVar26) {
        MenuItem("Main menu bar",(char *)0x0,&ShowDemoWindow::show_app_main_menu_bar,true);
        MenuItem("Console",(char *)0x0,&ShowDemoWindow::show_app_console,true);
        MenuItem("Log",(char *)0x0,&ShowDemoWindow::show_app_log,true);
        MenuItem("Simple layout",(char *)0x0,&ShowDemoWindow::show_app_layout,true);
        MenuItem("Property editor",(char *)0x0,&ShowDemoWindow::show_app_property_editor,true);
        MenuItem("Long text display",(char *)0x0,&ShowDemoWindow::show_app_long_text,true);
        MenuItem("Auto-resizing window",(char *)0x0,&ShowDemoWindow::show_app_auto_resize,true);
        MenuItem("Constrained-resizing window",(char *)0x0,
                 &ShowDemoWindow::show_app_constrained_resize,true);
        MenuItem("Simple overlay",(char *)0x0,&ShowDemoWindow::show_app_simple_overlay,true);
        MenuItem("Manipulating window titles",(char *)0x0,&ShowDemoWindow::show_app_window_titles,
                 true);
        MenuItem("Custom rendering",(char *)0x0,&ShowDemoWindow::show_app_custom_rendering,true);
        MenuItem("Documents",(char *)0x0,&ShowDemoWindow::show_app_documents,true);
        EndMenu();
      }
      bVar26 = BeginMenu("Tools",true);
      if (bVar26) {
        MenuItem("Metrics/Debugger",(char *)0x0,&ShowDemoWindow::show_app_metrics,true);
        MenuItem("Style Editor",(char *)0x0,&ShowDemoWindow::show_app_style_editor,true);
        MenuItem("About Dear ImGui",(char *)0x0,&ShowDemoWindow::show_app_about,true);
        EndMenu();
      }
      EndMenuBar();
    }
    Text("dear imgui says hello. (%s)");
    Spacing();
    bVar26 = CollapsingHeader("Help",0);
    if (bVar26) {
      Text("ABOUT THIS DEMO:");
      BulletText("Sections below are demonstrating many aspects of the library.");
      BulletText("The \"Examples\" menu above leads to more demo contents.");
      BulletText(
                "The \"Tools\" menu above gives access to: About Box, Style Editor,\nand Metrics/Debugger (general purpose Dear ImGui debugging tool)."
                );
      Separator();
      Text("PROGRAMMER GUIDE:");
      BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
      BulletText("See comments in imgui.cpp.");
      BulletText("See example applications in the examples/ folder.");
      BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
      BulletText("Set \'io.ConfigFlags |= NavEnableKeyboard\' for keyboard controls.");
      BulletText("Set \'io.ConfigFlags |= NavEnableGamepad\' for gamepad controls.");
      Separator();
      Text("USER GUIDE:");
      ShowUserGuide();
    }
    bVar26 = CollapsingHeader("Configuration",0);
    if (bVar26) {
      pIVar33 = GetIO();
      bVar26 = TreeNode("Configuration##2");
      if (bVar26) {
        CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",&pIVar33->ConfigFlags,1);
        SameLine(0.0,-1.0);
        HelpMarker("Enable keyboard controls.");
        CheckboxFlags("io.ConfigFlags: NavEnableGamepad",&pIVar33->ConfigFlags,2);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details."
                  );
        CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos",&pIVar33->ConfigFlags,4);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos."
                  );
        CheckboxFlags("io.ConfigFlags: NoMouse",&pIVar33->ConfigFlags,0x10);
        if ((pIVar33->ConfigFlags & 0x10) != 0) {
          dVar54 = GetTime();
          fVar51 = fmodf((float)dVar54,0.4);
          if (fVar51 < 0.2) {
            SameLine(0.0,-1.0);
            Text("<<PRESS SPACE TO DISABLE>>");
          }
          iVar41 = GetKeyIndex(0xc);
          bVar26 = IsKeyPressed(iVar41,true);
          if (bVar26) {
            *(byte *)&pIVar33->ConfigFlags = (byte)pIVar33->ConfigFlags & 0xef;
          }
        }
        CheckboxFlags("io.ConfigFlags: NoMouseCursorChange",&pIVar33->ConfigFlags,0x20);
        SameLine(0.0,-1.0);
        HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");
        Checkbox("io.ConfigInputTextCursorBlink",&pIVar33->ConfigInputTextCursorBlink);
        SameLine(0.0,-1.0);
        HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting)");
        Checkbox("io.ConfigDragClickToInputText",&pIVar33->ConfigDragClickToInputText);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving)."
                  );
        Checkbox("io.ConfigWindowsResizeFromEdges",&pIVar33->ConfigWindowsResizeFromEdges);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback."
                  );
        Checkbox("io.ConfigWindowsMoveFromTitleBarOnly",&pIVar33->ConfigWindowsMoveFromTitleBarOnly)
        ;
        Checkbox("io.MouseDrawCursor",&pIVar33->MouseDrawCursor);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something)."
                  );
        Text("Also see Style->Rendering for rendering options.");
        TreePop();
        Separator();
      }
      bVar26 = TreeNode("Backend Flags");
      if (bVar26) {
        HelpMarker(
                  "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\nHere we expose then as read-only fields to avoid breaking interactions with your backend."
                  );
        local_d8._0_4_ = pIVar33->BackendFlags;
        CheckboxFlags("io.BackendFlags: HasGamepad",(int *)local_d8,1);
        CheckboxFlags("io.BackendFlags: HasMouseCursors",(int *)local_d8,2);
        CheckboxFlags("io.BackendFlags: HasSetMousePos",(int *)local_d8,4);
        CheckboxFlags("io.BackendFlags: RendererHasVtxOffset",(int *)local_d8,8);
        TreePop();
        Separator();
      }
      bVar26 = TreeNode("Style");
      if (bVar26) {
        HelpMarker(
                  "The same contents can be accessed in \'Tools->Style Editor\' or by calling the ShowStyleEditor() function."
                  );
        ShowStyleEditor((ImGuiStyle *)0x0);
        TreePop();
        Separator();
      }
      bVar26 = TreeNode("Capture/Logging");
      if (bVar26) {
        HelpMarker(
                  "The logging API redirects all text output so you can easily capture the content of a window or a block. Tree nodes can be automatically expanded.\nTry opening any of the contents below in this window and then click one of the \"Log To\" button."
                  );
        LogButtons();
        HelpMarker(
                  "You can also call ImGui::LogText() to output directly to the log without a visual output."
                  );
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Copy \"Hello, world!\" to clipboard",(ImVec2 *)local_d8);
        if (bVar26) {
          LogToClipboard(-1);
          LogText("Hello, world!");
          LogFinish();
        }
        TreePop();
      }
    }
    bVar26 = CollapsingHeader("Window options",0);
    if (bVar26) {
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar26 = BeginTable("split",3,0,(ImVec2 *)local_d8,0.0);
      if (bVar26) {
        TableNextColumn();
        Checkbox("No titlebar",&ShowDemoWindow::no_titlebar);
        TableNextColumn();
        Checkbox("No scrollbar",&ShowDemoWindow::no_scrollbar);
        TableNextColumn();
        Checkbox("No menu",&ShowDemoWindow::no_menu);
        TableNextColumn();
        Checkbox("No move",&ShowDemoWindow::no_move);
        TableNextColumn();
        Checkbox("No resize",&ShowDemoWindow::no_resize);
        TableNextColumn();
        Checkbox("No collapse",&ShowDemoWindow::no_collapse);
        TableNextColumn();
        Checkbox("No close",&ShowDemoWindow::no_close);
        TableNextColumn();
        Checkbox("No nav",&ShowDemoWindow::no_nav);
        TableNextColumn();
        Checkbox("No background",&ShowDemoWindow::no_background);
        TableNextColumn();
        Checkbox("No bring to front",&ShowDemoWindow::no_bring_to_front);
        EndTable();
      }
    }
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    bVar26 = CollapsingHeader("Popups & Modal windows",0);
    if (bVar26) {
      bVar26 = TreeNode("Popups");
      if (bVar26) {
        TextWrapped(
                   "When a popup is active, it inhibits interacting with windows that are behind the popup. Clicking outside the popup closes it."
                   );
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Select..",(ImVec2 *)local_d8);
        if (bVar26) {
          OpenPopup("my_select_popup",0);
        }
        SameLine(0.0,-1.0);
        if ((long)ShowDemoWindowPopups()::selected_fish == -1) {
          pcVar45 = "<None>";
        }
        else {
          pcVar45 = (&PTR_anon_var_dwarf_3cd54_00228cc0)[ShowDemoWindowPopups()::selected_fish];
        }
        TextUnformatted(pcVar45,(char *)0x0);
        bVar26 = BeginPopup("my_select_popup",0);
        if (bVar26) {
          lVar43 = 0;
          Text("Aquarium");
          Separator();
          ppuVar50 = &PTR_anon_var_dwarf_3cd54_00228cc0;
          do {
            local_d8._0_4_ = 0.0;
            local_d8._4_4_ = 0.0;
            bVar26 = Selectable(*ppuVar50,false,0,(ImVec2 *)local_d8);
            if (bVar26) {
              ShowDemoWindowPopups()::selected_fish = (int)lVar43;
            }
            lVar43 = lVar43 + 1;
            ppuVar50 = ppuVar50 + 1;
          } while (lVar43 != 5);
          EndPopup();
        }
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Toggle..",(ImVec2 *)local_d8);
        if (bVar26) {
          OpenPopup("my_toggle_popup",0);
        }
        bVar26 = BeginPopup("my_toggle_popup",0);
        if (bVar26) {
          pbVar42 = (bool *)&ShowDemoWindowPopups()::toggles;
          lVar43 = 0;
          do {
            MenuItem(*(char **)((long)&PTR_anon_var_dwarf_3cd54_00228cc0 + lVar43),"",pbVar42,true);
            lVar43 = lVar43 + 8;
            pbVar42 = pbVar42 + 1;
          } while (lVar43 != 0x28);
          bVar26 = BeginMenu("Sub-menu",true);
          if (bVar26) {
            MenuItem("Click me",(char *)0x0,false,true);
            EndMenu();
          }
          Separator();
          Text("Tooltip here");
          bVar26 = IsItemHovered(0);
          if (bVar26) {
            SetTooltip("I am a tooltip over a popup");
          }
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          bVar26 = Button("Stacked Popup",(ImVec2 *)local_d8);
          if (bVar26) {
            OpenPopup("another popup",0);
          }
          bVar26 = BeginPopup("another popup",0);
          if (bVar26) {
            pbVar42 = (bool *)&ShowDemoWindowPopups()::toggles;
            lVar43 = 0;
            do {
              MenuItem(*(char **)((long)&PTR_anon_var_dwarf_3cd54_00228cc0 + lVar43),"",pbVar42,true
                      );
              lVar43 = lVar43 + 8;
              pbVar42 = pbVar42 + 1;
            } while (lVar43 != 0x28);
            bVar26 = BeginMenu("Sub-menu",true);
            if (bVar26) {
              MenuItem("Click me",(char *)0x0,false,true);
              local_d8._0_4_ = 0.0;
              local_d8._4_4_ = 0.0;
              bVar26 = Button("Stacked Popup",(ImVec2 *)local_d8);
              if (bVar26) {
                OpenPopup("another popup",0);
              }
              bVar26 = BeginPopup("another popup",0);
              if (bVar26) {
                Text("I am the last one here.");
                EndPopup();
              }
              EndMenu();
            }
            EndPopup();
          }
          EndPopup();
        }
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("File Menu..",(ImVec2 *)local_d8);
        if (bVar26) {
          OpenPopup("my_file_popup",0);
        }
        bVar26 = BeginPopup("my_file_popup",0);
        if (bVar26) {
          ShowExampleMenuFile();
          EndPopup();
        }
        TreePop();
      }
      bVar26 = TreeNode("Context menus");
      if (bVar26) {
        Text("Value = %.3f (<-- right-click here)",(double)ShowDemoWindowPopups()::value);
        bVar26 = BeginPopupContextItem("item context menu",1);
        if (bVar26) {
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          bVar26 = Selectable("Set to zero",false,0,(ImVec2 *)local_d8);
          if (bVar26) {
            ShowDemoWindowPopups()::value = 0.0;
          }
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          bVar26 = Selectable("Set to PI",false,0,(ImVec2 *)local_d8);
          if (bVar26) {
            ShowDemoWindowPopups()::value = 3.1415;
          }
          SetNextItemWidth(-1.0);
          DragFloat("##Value",&ShowDemoWindowPopups()::value,0.1,0.0,0.0,"%.3f",0);
          EndPopup();
        }
        Text("(You can also right-click me to open the same popup as above.)");
        OpenPopupOnItemClick("item context menu",1);
        sprintf(local_d8,"Button: %s###Button",ShowDemoWindowPopups()::name);
        local_148.x = 0.0;
        local_148.y = 0.0;
        Button(local_d8,&local_148);
        bVar26 = BeginPopupContextItem((char *)0x0,1);
        if (bVar26) {
          Text("Edit name:");
          InputText("##edit",ShowDemoWindowPopups()::name,0x20,0,(ImGuiInputTextCallback)0x0,
                    (void *)0x0);
          local_148.x = 0.0;
          local_148.y = 0.0;
          bVar26 = Button("Close",&local_148);
          if (bVar26) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        SameLine(0.0,-1.0);
        Text("(<-- right-click here)");
        TreePop();
      }
      bVar26 = TreeNode("Modals");
      if (bVar26) {
        TextWrapped(
                   "Modal windows are like popups but the user cannot close them by clicking outside."
                   );
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Delete..",(ImVec2 *)local_d8);
        if (bVar26) {
          OpenPopup("Delete?",0);
        }
        pIVar33 = GetIO();
        IVar55 = pIVar33->DisplaySize;
        pIVar33 = GetIO();
        local_158 = IVar55.x;
        local_d8._0_4_ = local_158 * 0.5;
        local_d8._4_4_ = (pIVar33->DisplaySize).y * 0.5;
        local_148.x = 0.5;
        local_148.y = 0.5;
        SetNextWindowPos((ImVec2 *)local_d8,8,&local_148);
        bVar26 = BeginPopupModal("Delete?",(bool *)0x0,0x40);
        if (bVar26) {
          Text("All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n");
          Separator();
          local_148.x = 0.0;
          local_148.y = 0.0;
          PushStyleVar(10,&local_148);
          Checkbox("Don\'t ask me next time",(bool *)&ShowDemoWindowPopups()::dont_ask_me_next_time)
          ;
          PopStyleVar(1);
          local_148.x = 120.0;
          local_148.y = 0.0;
          bVar26 = Button("OK",&local_148);
          if (bVar26) {
            CloseCurrentPopup();
          }
          SetItemDefaultFocus();
          SameLine(0.0,-1.0);
          local_148.x = 120.0;
          local_148.y = 0.0;
          bVar26 = Button("Cancel",&local_148);
          if (bVar26) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        local_148.x = 0.0;
        local_148.y = 0.0;
        bVar26 = Button("Stacked modals..",&local_148);
        if (bVar26) {
          OpenPopup("Stacked 1",0);
        }
        bVar26 = BeginPopupModal("Stacked 1",(bool *)0x0,0x400);
        if (bVar26) {
          bVar26 = BeginMenuBar();
          if (bVar26) {
            bVar26 = BeginMenu("File",true);
            if (bVar26) {
              MenuItem("Some menu item",(char *)0x0,false,true);
              EndMenu();
            }
            EndMenuBar();
          }
          Text(
              "Hello from Stacked The First\nUsing style.Colors[ImGuiCol_ModalWindowDimBg] behind it."
              );
          Combo("Combo",&ShowDemoWindowPopups()::item,"aaaa",-1);
          ColorEdit4("color",(float *)ShowDemoWindowPopups()::color,0);
          local_148.x = 0.0;
          local_148.y = 0.0;
          bVar26 = Button("Add another modal..",&local_148);
          if (bVar26) {
            OpenPopup("Stacked 2",0);
          }
          local_110.x._0_1_ = 1;
          bVar26 = BeginPopupModal("Stacked 2",(bool *)&local_110,0);
          if (bVar26) {
            Text("Hello from Stacked The Second!");
            local_148.x = 0.0;
            local_148.y = 0.0;
            bVar26 = Button("Close",&local_148);
            if (bVar26) {
              CloseCurrentPopup();
            }
            EndPopup();
          }
          local_148.x = 0.0;
          local_148.y = 0.0;
          bVar26 = Button("Close",&local_148);
          if (bVar26) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        TreePop();
      }
      bVar26 = TreeNode("Menus inside a regular window");
      if (bVar26) {
        TextWrapped(
                   "Below we are testing adding menu items to a regular window. It\'s rather unusual but should work!"
                   );
        Separator();
        PushID("foo");
        MenuItem("Menu item","CTRL+M",false,true);
        bVar26 = BeginMenu("Menu inside a regular window",true);
        if (bVar26) {
          ShowExampleMenuFile();
          EndMenu();
        }
        PopID();
        Separator();
        TreePop();
      }
    }
    ShowDemoWindowTables();
    bVar26 = CollapsingHeader("Filtering",0);
    if (bVar26) {
      if ((ShowDemoWindowMisc()::filter == '\0') &&
         (iVar41 = __cxa_guard_acquire(&ShowDemoWindowMisc()::filter), iVar41 != 0)) {
        ImGuiTextFilter::ImGuiTextFilter((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"");
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,ShowDemoWindowMisc()::filter,&__dso_handle);
        __cxa_guard_release(&ShowDemoWindowMisc()::filter);
      }
      Text(
          "Filter usage:\n  \"\"         display all lines\n  \"xxx\"      display lines containing \"xxx\"\n  \"xxx,yyy\"  display lines containing \"xxx\" or \"yyy\"\n  \"-xxx\"     hide lines containing \"xxx\""
          );
      ImGuiTextFilter::Draw((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"Filter (inc,-exc)",0.0)
      ;
      lVar43 = 0;
      do {
        bVar26 = ImGuiTextFilter::PassFilter
                           ((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,
                            *(char **)((long)&PTR_anon_var_dwarf_43238_00228f60 + lVar43),
                            (char *)0x0);
        if (bVar26) {
          BulletText("%s");
        }
        lVar43 = lVar43 + 8;
      } while (lVar43 != 0x40);
    }
    bVar26 = CollapsingHeader("Inputs, Navigation & Focus",0);
    if (bVar26) {
      pIVar33 = GetIO();
      Text("WantCaptureMouse: %d",(ulong)pIVar33->WantCaptureMouse);
      Text("WantCaptureKeyboard: %d",(ulong)pIVar33->WantCaptureKeyboard);
      Text("WantTextInput: %d",(ulong)pIVar33->WantTextInput);
      Text("WantSetMousePos: %d",(ulong)pIVar33->WantSetMousePos);
      Text("NavActive: %d, NavVisible: %d",(ulong)pIVar33->NavActive,(ulong)pIVar33->NavVisible);
      bVar26 = TreeNode("Keyboard, Mouse & Navigation State");
      if (bVar26) {
        bVar26 = IsMousePosValid((ImVec2 *)0x0);
        if (bVar26) {
          Text("Mouse pos: (%g, %g)",(double)(pIVar33->MousePos).x,(double)(pIVar33->MousePos).y);
        }
        else {
          Text("Mouse pos: <INVALID>");
        }
        Text("Mouse delta: (%g, %g)",(double)(pIVar33->MouseDelta).x);
        lVar43 = 0;
        Text("Mouse down:");
        do {
          if (0.0 <= pIVar33->MouseDownDuration[lVar43]) {
            SameLine(0.0,-1.0);
            Text("b%d (%.02f secs)",(double)pIVar33->MouseDownDuration[lVar43]);
          }
          lVar43 = lVar43 + 1;
        } while (lVar43 != 5);
        Text("Mouse clicked:");
        iVar41 = 0;
        do {
          bVar26 = IsMouseClicked(iVar41,false);
          if (bVar26) {
            SameLine(0.0,-1.0);
            Text("b%d");
          }
          iVar41 = iVar41 + 1;
        } while (iVar41 != 5);
        Text("Mouse dblclick:");
        uVar38 = 0;
        do {
          bVar26 = IsMouseDoubleClicked(uVar38);
          if (bVar26) {
            SameLine(0.0,-1.0);
            Text("b%d",(ulong)uVar38);
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 != 5);
        Text("Mouse released:");
        uVar38 = 0;
        do {
          bVar26 = IsMouseReleased(uVar38);
          if (bVar26) {
            SameLine(0.0,-1.0);
            Text("b%d",(ulong)uVar38);
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 != 5);
        Text("Mouse wheel: %.1f",(double)pIVar33->MouseWheel);
        uVar67 = 0;
        Text("Keys down:");
        do {
          if (0.0 <= pIVar33->KeysDownDuration[uVar67]) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X) (%.02f secs)",(double)pIVar33->KeysDownDuration[uVar67],
                 uVar67 & 0xffffffff,uVar67 & 0xffffffff);
          }
          uVar67 = uVar67 + 1;
        } while (uVar67 != 0x200);
        Text("Keys pressed:");
        uVar38 = 0;
        do {
          bVar26 = IsKeyPressed(uVar38,true);
          if (bVar26) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X)",(ulong)uVar38,(ulong)uVar38);
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 != 0x200);
        Text("Keys release:");
        uVar67 = 0;
        do {
          bVar26 = IsKeyReleased((int)uVar67);
          if (bVar26) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X)",uVar67,uVar67);
          }
          uVar38 = (int)uVar67 + 1;
          uVar67 = (ulong)uVar38;
        } while (uVar38 != 0x200);
        pcVar45 = "CTRL ";
        if (pIVar33->KeyCtrl == false) {
          pcVar45 = "";
        }
        pcVar44 = "SHIFT ";
        if (pIVar33->KeyShift == false) {
          pcVar44 = "";
        }
        Text("Keys mods: %s%s%s%s",pcVar45,pcVar44);
        Text("Chars queue:");
        if (0 < (pIVar33->InputQueueCharacters).Size) {
          lVar43 = 0;
          do {
            uVar2 = (pIVar33->InputQueueCharacters).Data[lVar43];
            SameLine(0.0,-1.0);
            uVar38 = (int)(char)uVar2;
            if (0xde < (ushort)(uVar2 - 0x21)) {
              uVar38 = 0x3f;
            }
            Text("\'%c\' (0x%04X)",(ulong)uVar38,(ulong)uVar2);
            lVar43 = lVar43 + 1;
          } while (lVar43 < (pIVar33->InputQueueCharacters).Size);
        }
        uVar67 = 0;
        Text("NavInputs down:");
        do {
          if (0.0 < pIVar33->NavInputs[uVar67]) {
            SameLine(0.0,-1.0);
            Text("[%d] %.2f",(double)pIVar33->NavInputs[uVar67],uVar67 & 0xffffffff);
          }
          uVar67 = uVar67 + 1;
        } while (uVar67 != 0x15);
        Text("NavInputs pressed:");
        uVar67 = 0;
        do {
          if ((pIVar33->NavInputsDownDuration[uVar67] == 0.0) &&
             (!NAN(pIVar33->NavInputsDownDuration[uVar67]))) {
            SameLine(0.0,-1.0);
            Text("[%d]",uVar67 & 0xffffffff);
          }
          uVar67 = uVar67 + 1;
        } while (uVar67 != 0x15);
        uVar67 = 0;
        Text("NavInputs duration:");
        do {
          if (0.0 <= pIVar33->NavInputsDownDuration[uVar67]) {
            SameLine(0.0,-1.0);
            Text("[%d] %.2f",(double)pIVar33->NavInputsDownDuration[uVar67],uVar67 & 0xffffffff);
          }
          uVar67 = uVar67 + 1;
        } while (uVar67 != 0x15);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        Button("Hovering me sets the\nkeyboard capture flag",(ImVec2 *)local_d8);
        bVar26 = IsItemHovered(0);
        if (bVar26) {
          CaptureKeyboardFromApp(true);
        }
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        Button("Holding me clears the\nthe keyboard capture flag",(ImVec2 *)local_d8);
        bVar26 = IsItemActive();
        if (bVar26) {
          CaptureKeyboardFromApp(false);
        }
        TreePop();
      }
      bVar26 = TreeNode("Tabbing");
      if (bVar26) {
        Text("Use TAB/SHIFT+TAB to cycle through keyboard editable fields.");
        InputText("1",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("2",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("3",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        PushAllowKeyboardFocus(false);
        InputText("4 (tab skip)",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        PopAllowKeyboardFocus();
        InputText("5",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      bVar26 = TreeNode("Focus from code");
      if (bVar26) {
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Focus on 1",(ImVec2 *)local_d8);
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar27 = Button("Focus on 2",(ImVec2 *)local_d8);
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar28 = Button("Focus on 3",(ImVec2 *)local_d8);
        if (bVar26) {
          SetKeyboardFocusHere(0);
        }
        InputText("1",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        bVar26 = IsItemActive();
        uVar38 = (uint)bVar26;
        if (bVar27) {
          SetKeyboardFocusHere(0);
        }
        InputText("2",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        bVar26 = IsItemActive();
        if (bVar26) {
          uVar38 = 2;
        }
        PushAllowKeyboardFocus(false);
        if (bVar28) {
          SetKeyboardFocusHere(0);
        }
        InputText("3 (tab skip)",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        bVar26 = IsItemActive();
        if (bVar26) {
          uVar38 = 3;
        }
        PopAllowKeyboardFocus();
        if (uVar38 == 0) {
          Text("Item with focus: <none>");
        }
        else {
          Text("Item with focus: %d",(ulong)uVar38);
        }
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Focus on X",(ImVec2 *)local_d8);
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar27 = Button("Focus on Y",(ImVec2 *)local_d8);
        iVar41 = 1;
        if (!bVar27) {
          iVar41 = bVar26 - 1;
        }
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Focus on Z",(ImVec2 *)local_d8);
        iVar66 = 2;
        if (!bVar26) {
          iVar66 = iVar41;
        }
        if (iVar66 != -1) {
          SetKeyboardFocusHere(iVar66);
        }
        SliderFloat3("Float3",(float *)ShowDemoWindowMisc()::f3,0.0,1.0,"%.3f",0);
        TextWrapped("NB: Cursor & selection are preserved when refocusing last used item in code.");
        TreePop();
      }
      bVar26 = TreeNode("Dragging");
      if (bVar26) {
        TextWrapped(
                   "You can use ImGui::GetMouseDragDelta(0) to query for the dragged amount on any widget."
                   );
        uVar38 = 0;
        do {
          Text("IsMouseDragging(%d):",(ulong)uVar38);
          bVar26 = IsMouseDragging(uVar38,-1.0);
          Text("  w/ default threshold: %d,",(ulong)bVar26);
          bVar26 = IsMouseDragging(uVar38,0.0);
          Text("  w/ zero threshold: %d,",(ulong)bVar26);
          bVar26 = IsMouseDragging(uVar38,20.0);
          Text("  w/ large threshold: %d,",(ulong)bVar26);
          uVar38 = uVar38 + 1;
        } while (uVar38 != 3);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        Button("Drag Me",(ImVec2 *)local_d8);
        bVar26 = IsItemActive();
        if (bVar26) {
          pIVar34 = GetForegroundDrawList();
          IVar29 = GetColorU32(0x15,1.0);
          ImDrawList::AddLine(pIVar34,pIVar33->MouseClickedPos,&pIVar33->MousePos,IVar29,4.0);
        }
        IVar55 = GetMouseDragDelta(0,0.0);
        uStack_100 = extraout_XMM0_Qb_02;
        local_108._0_4_ = IVar55.x;
        local_108._4_4_ = IVar55.y;
        local_48 = GetMouseDragDelta(0,-1.0);
        fVar51 = (pIVar33->MouseDelta).x;
        local_128 = (undefined1  [8])(double)(pIVar33->MouseDelta).y;
        uStack_40 = extraout_XMM0_Qb_03;
        Text("GetMouseDragDelta(0):");
        Text("  w/ default threshold: (%.1f, %.1f)",(double)local_48.x,(double)local_48.y);
        Text("  w/ zero threshold: (%.1f, %.1f)",(double)(float)local_108._0_4_,
             (double)(float)local_108._4_4_);
        Text("io.MouseDelta: (%.1f, %.1f)",(double)fVar51,local_128);
        TreePop();
      }
      bVar26 = TreeNode("Mouse cursors");
      if (bVar26) {
        IVar31 = GetMouseCursor();
        puVar47 = &DAT_00228fa0;
        Text("Current mouse cursor = %d: %s",(long)IVar31,(&DAT_00228fa0)[IVar31]);
        Text("Hover to see mouse cursors:");
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Your application can render a different mouse cursor based on what ImGui::GetMouseCursor() returns. If software cursor rendering (io.MouseDrawCursor) is set ImGui will draw the right cursor for you, otherwise your backend needs to handle it."
                  );
        uVar67 = 0;
        do {
          sprintf(local_d8,"Mouse cursor %d: %s",uVar67 & 0xffffffff,*puVar47);
          Bullet();
          local_148.x = 0.0;
          local_148.y = 0.0;
          Selectable(local_d8,false,0,&local_148);
          bVar26 = IsItemHovered(0);
          if (bVar26) {
            SetMouseCursor((ImGuiMouseCursor)uVar67);
          }
          uVar67 = uVar67 + 1;
          puVar47 = puVar47 + 1;
        } while (uVar67 != 9);
        TreePop();
      }
    }
    PopItemWidth();
  }
  End();
  return;
}

Assistant:

void ImGui::ShowDemoWindow(bool* p_open)
{
    // Exceptionally add an extra assert here for people confused about initial Dear ImGui setup
    // Most ImGui functions would normally just crash if the context is missing.
    IM_ASSERT(ImGui::GetCurrentContext() != NULL && "Missing dear imgui context. Refer to examples app!");

    // Examples Apps (accessible from the "Examples" menu)
    static bool show_app_main_menu_bar = false;
    static bool show_app_documents = false;
    static bool show_app_console = false;
    static bool show_app_log = false;
    static bool show_app_layout = false;
    static bool show_app_property_editor = false;
    static bool show_app_long_text = false;
    static bool show_app_auto_resize = false;
    static bool show_app_constrained_resize = false;
    static bool show_app_simple_overlay = false;
    static bool show_app_window_titles = false;
    static bool show_app_custom_rendering = false;

    if (show_app_main_menu_bar)       ShowExampleAppMainMenuBar();
    if (show_app_documents)           ShowExampleAppDocuments(&show_app_documents);

    if (show_app_console)             ShowExampleAppConsole(&show_app_console);
    if (show_app_log)                 ShowExampleAppLog(&show_app_log);
    if (show_app_layout)              ShowExampleAppLayout(&show_app_layout);
    if (show_app_property_editor)     ShowExampleAppPropertyEditor(&show_app_property_editor);
    if (show_app_long_text)           ShowExampleAppLongText(&show_app_long_text);
    if (show_app_auto_resize)         ShowExampleAppAutoResize(&show_app_auto_resize);
    if (show_app_constrained_resize)  ShowExampleAppConstrainedResize(&show_app_constrained_resize);
    if (show_app_simple_overlay)      ShowExampleAppSimpleOverlay(&show_app_simple_overlay);
    if (show_app_window_titles)       ShowExampleAppWindowTitles(&show_app_window_titles);
    if (show_app_custom_rendering)    ShowExampleAppCustomRendering(&show_app_custom_rendering);

    // Dear ImGui Apps (accessible from the "Tools" menu)
    static bool show_app_metrics = false;
    static bool show_app_style_editor = false;
    static bool show_app_about = false;

    if (show_app_metrics)       { ImGui::ShowMetricsWindow(&show_app_metrics); }
    if (show_app_about)         { ImGui::ShowAboutWindow(&show_app_about); }
    if (show_app_style_editor)
    {
        ImGui::Begin("Dear ImGui Style Editor", &show_app_style_editor);
        ImGui::ShowStyleEditor();
        ImGui::End();
    }

    // Demonstrate the various window flags. Typically you would just use the default!
    static bool no_titlebar = false;
    static bool no_scrollbar = false;
    static bool no_menu = false;
    static bool no_move = false;
    static bool no_resize = false;
    static bool no_collapse = false;
    static bool no_close = false;
    static bool no_nav = false;
    static bool no_background = false;
    static bool no_bring_to_front = false;

    ImGuiWindowFlags window_flags = 0;
    if (no_titlebar)        window_flags |= ImGuiWindowFlags_NoTitleBar;
    if (no_scrollbar)       window_flags |= ImGuiWindowFlags_NoScrollbar;
    if (!no_menu)           window_flags |= ImGuiWindowFlags_MenuBar;
    if (no_move)            window_flags |= ImGuiWindowFlags_NoMove;
    if (no_resize)          window_flags |= ImGuiWindowFlags_NoResize;
    if (no_collapse)        window_flags |= ImGuiWindowFlags_NoCollapse;
    if (no_nav)             window_flags |= ImGuiWindowFlags_NoNav;
    if (no_background)      window_flags |= ImGuiWindowFlags_NoBackground;
    if (no_bring_to_front)  window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus;
    if (no_close)           p_open = NULL; // Don't pass our bool* to Begin

    // We specify a default position/size in case there's no data in the .ini file.
    // We only do it to make the demo applications a little more welcoming, but typically this isn't required.
    ImGui::SetNextWindowPos(ImVec2(650, 20), ImGuiCond_FirstUseEver);
    ImGui::SetNextWindowSize(ImVec2(550, 680), ImGuiCond_FirstUseEver);

    // Main body of the Demo window starts here.
    if (!ImGui::Begin("Dear ImGui Demo", p_open, window_flags))
    {
        // Early out if the window is collapsed, as an optimization.
        ImGui::End();
        return;
    }

    // Most "big" widgets share a common width settings by default. See 'Demo->Layout->Widgets Width' for details.

    // e.g. Use 2/3 of the space for widgets and 1/3 for labels (right align)
    //ImGui::PushItemWidth(-ImGui::GetWindowWidth() * 0.35f);

    // e.g. Leave a fixed amount of width for labels (by passing a negative value), the rest goes to widgets.
    ImGui::PushItemWidth(ImGui::GetFontSize() * -12);

    // Menu Bar
    if (ImGui::BeginMenuBar())
    {
        if (ImGui::BeginMenu("Menu"))
        {
            ShowExampleMenuFile();
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Examples"))
        {
            ImGui::MenuItem("Main menu bar", NULL, &show_app_main_menu_bar);
            ImGui::MenuItem("Console", NULL, &show_app_console);
            ImGui::MenuItem("Log", NULL, &show_app_log);
            ImGui::MenuItem("Simple layout", NULL, &show_app_layout);
            ImGui::MenuItem("Property editor", NULL, &show_app_property_editor);
            ImGui::MenuItem("Long text display", NULL, &show_app_long_text);
            ImGui::MenuItem("Auto-resizing window", NULL, &show_app_auto_resize);
            ImGui::MenuItem("Constrained-resizing window", NULL, &show_app_constrained_resize);
            ImGui::MenuItem("Simple overlay", NULL, &show_app_simple_overlay);
            ImGui::MenuItem("Manipulating window titles", NULL, &show_app_window_titles);
            ImGui::MenuItem("Custom rendering", NULL, &show_app_custom_rendering);
            ImGui::MenuItem("Documents", NULL, &show_app_documents);
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Tools"))
        {
            ImGui::MenuItem("Metrics/Debugger", NULL, &show_app_metrics);
            ImGui::MenuItem("Style Editor", NULL, &show_app_style_editor);
            ImGui::MenuItem("About Dear ImGui", NULL, &show_app_about);
            ImGui::EndMenu();
        }
        ImGui::EndMenuBar();
    }

    ImGui::Text("dear imgui says hello. (%s)", IMGUI_VERSION);
    ImGui::Spacing();

    if (ImGui::CollapsingHeader("Help"))
    {
        ImGui::Text("ABOUT THIS DEMO:");
        ImGui::BulletText("Sections below are demonstrating many aspects of the library.");
        ImGui::BulletText("The \"Examples\" menu above leads to more demo contents.");
        ImGui::BulletText("The \"Tools\" menu above gives access to: About Box, Style Editor,\n"
                          "and Metrics/Debugger (general purpose Dear ImGui debugging tool).");
        ImGui::Separator();

        ImGui::Text("PROGRAMMER GUIDE:");
        ImGui::BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
        ImGui::BulletText("See comments in imgui.cpp.");
        ImGui::BulletText("See example applications in the examples/ folder.");
        ImGui::BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableKeyboard' for keyboard controls.");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableGamepad' for gamepad controls.");
        ImGui::Separator();

        ImGui::Text("USER GUIDE:");
        ImGui::ShowUserGuide();
    }

    if (ImGui::CollapsingHeader("Configuration"))
    {
        ImGuiIO& io = ImGui::GetIO();

        if (ImGui::TreeNode("Configuration##2"))
        {
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",    &io.ConfigFlags, ImGuiConfigFlags_NavEnableKeyboard);
            ImGui::SameLine(); HelpMarker("Enable keyboard controls.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableGamepad",     &io.ConfigFlags, ImGuiConfigFlags_NavEnableGamepad);
            ImGui::SameLine(); HelpMarker("Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos", &io.ConfigFlags, ImGuiConfigFlags_NavEnableSetMousePos);
            ImGui::SameLine(); HelpMarker("Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos.");
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouse",              &io.ConfigFlags, ImGuiConfigFlags_NoMouse);
            if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
            {
                // The "NoMouse" option can get us stuck with a disabled mouse! Let's provide an alternative way to fix it:
                if (fmodf((float)ImGui::GetTime(), 0.40f) < 0.20f)
                {
                    ImGui::SameLine();
                    ImGui::Text("<<PRESS SPACE TO DISABLE>>");
                }
                if (ImGui::IsKeyPressed(ImGui::GetKeyIndex(ImGuiKey_Space)))
                    io.ConfigFlags &= ~ImGuiConfigFlags_NoMouse;
            }
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouseCursorChange", &io.ConfigFlags, ImGuiConfigFlags_NoMouseCursorChange);
            ImGui::SameLine(); HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");
            ImGui::Checkbox("io.ConfigInputTextCursorBlink", &io.ConfigInputTextCursorBlink);
            ImGui::SameLine(); HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting)");
            ImGui::Checkbox("io.ConfigDragClickToInputText", &io.ConfigDragClickToInputText);
            ImGui::SameLine(); HelpMarker("Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving).");
            ImGui::Checkbox("io.ConfigWindowsResizeFromEdges", &io.ConfigWindowsResizeFromEdges);
            ImGui::SameLine(); HelpMarker("Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback.");
            ImGui::Checkbox("io.ConfigWindowsMoveFromTitleBarOnly", &io.ConfigWindowsMoveFromTitleBarOnly);
            ImGui::Checkbox("io.MouseDrawCursor", &io.MouseDrawCursor);
            ImGui::SameLine(); HelpMarker("Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something).");
            ImGui::Text("Also see Style->Rendering for rendering options.");
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Backend Flags"))
        {
            HelpMarker(
                "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\n"
                "Here we expose then as read-only fields to avoid breaking interactions with your backend.");

            // Make a local copy to avoid modifying actual backend flags.
            ImGuiBackendFlags backend_flags = io.BackendFlags;
            ImGui::CheckboxFlags("io.BackendFlags: HasGamepad",           &backend_flags, ImGuiBackendFlags_HasGamepad);
            ImGui::CheckboxFlags("io.BackendFlags: HasMouseCursors",      &backend_flags, ImGuiBackendFlags_HasMouseCursors);
            ImGui::CheckboxFlags("io.BackendFlags: HasSetMousePos",       &backend_flags, ImGuiBackendFlags_HasSetMousePos);
            ImGui::CheckboxFlags("io.BackendFlags: RendererHasVtxOffset", &backend_flags, ImGuiBackendFlags_RendererHasVtxOffset);
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Style"))
        {
            HelpMarker("The same contents can be accessed in 'Tools->Style Editor' or by calling the ShowStyleEditor() function.");
            ImGui::ShowStyleEditor();
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Capture/Logging"))
        {
            HelpMarker(
                "The logging API redirects all text output so you can easily capture the content of "
                "a window or a block. Tree nodes can be automatically expanded.\n"
                "Try opening any of the contents below in this window and then click one of the \"Log To\" button.");
            ImGui::LogButtons();

            HelpMarker("You can also call ImGui::LogText() to output directly to the log without a visual output.");
            if (ImGui::Button("Copy \"Hello, world!\" to clipboard"))
            {
                ImGui::LogToClipboard();
                ImGui::LogText("Hello, world!");
                ImGui::LogFinish();
            }
            ImGui::TreePop();
        }
    }

    if (ImGui::CollapsingHeader("Window options"))
    {
        if (ImGui::BeginTable("split", 3))
        {
            ImGui::TableNextColumn(); ImGui::Checkbox("No titlebar", &no_titlebar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No scrollbar", &no_scrollbar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No menu", &no_menu);
            ImGui::TableNextColumn(); ImGui::Checkbox("No move", &no_move);
            ImGui::TableNextColumn(); ImGui::Checkbox("No resize", &no_resize);
            ImGui::TableNextColumn(); ImGui::Checkbox("No collapse", &no_collapse);
            ImGui::TableNextColumn(); ImGui::Checkbox("No close", &no_close);
            ImGui::TableNextColumn(); ImGui::Checkbox("No nav", &no_nav);
            ImGui::TableNextColumn(); ImGui::Checkbox("No background", &no_background);
            ImGui::TableNextColumn(); ImGui::Checkbox("No bring to front", &no_bring_to_front);
            ImGui::EndTable();
        }
    }

    // All demo contents
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    ShowDemoWindowPopups();
    ShowDemoWindowTables();
    ShowDemoWindowMisc();

    // End of ShowDemoWindow()
    ImGui::PopItemWidth();
    ImGui::End();
}